

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [12];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  long lVar64;
  byte bVar65;
  byte bVar66;
  ulong uVar67;
  byte bVar68;
  long lVar69;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  ulong uVar70;
  bool bVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar142;
  uint uVar143;
  uint uVar145;
  uint uVar146;
  uint uVar147;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  uint uVar144;
  uint uVar148;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar141 [32];
  float pp;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar178 [16];
  undefined1 auVar183 [32];
  float fVar184;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar211 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar219 [32];
  undefined1 auVar218 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar228;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [16];
  undefined1 auVar239 [32];
  undefined1 auVar238 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  float fVar244;
  undefined1 auVar242 [16];
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar243 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  float fVar254;
  float fVar261;
  undefined1 auVar257 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar259;
  float fVar260;
  undefined1 auVar258 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  float s;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar270;
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_acc;
  RTCFilterFunctionNArguments local_850;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  Primitive *local_6b0;
  ulong local_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  RTCHitN local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar137 [32];
  undefined1 auVar140 [32];
  undefined1 auVar158 [32];
  
  uVar72 = (ulong)(byte)prim[1];
  lVar64 = uVar72 * 0x25;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar103 = vpmovsxbd_avx2(auVar75);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar100 = vpmovsxbd_avx2(auVar74);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar105 = vpmovsxbd_avx2(auVar77);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar72 * 0xf + 6);
  auVar106 = vpmovsxbd_avx2(auVar78);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar104 = vpmovsxbd_avx2(auVar85);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar72 * 0x11 + 6);
  auVar101 = vpmovsxbd_avx2(auVar3);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar72 * 0x1a + 6);
  auVar102 = vpmovsxbd_avx2(auVar76);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar72 * 0x1b + 6);
  auVar95 = vpmovsxbd_avx2(auVar79);
  fVar2 = *(float *)(prim + lVar64 + 0x12);
  auVar81._4_4_ = fVar2;
  auVar81._0_4_ = fVar2;
  auVar81._8_4_ = fVar2;
  auVar81._12_4_ = fVar2;
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar75 = vsubps_avx(auVar75,*(undefined1 (*) [16])(prim + lVar64 + 6));
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar72 * 0x1c + 6);
  auVar96 = vpmovsxbd_avx2(auVar80);
  fVar228 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar64 + 0x16)) *
            *(float *)(prim + lVar64 + 0x1a);
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0xb + 6));
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar86 = vpbroadcastd_avx512vl();
  auVar87 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar72 * 0xd + 6));
  auVar88 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar72 * 0x12 + 6));
  auVar89 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar72 * 0x16 + 6));
  auVar74 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar74 = vinsertps_avx512f(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar270 = fVar2 * auVar75._0_4_;
  auVar74 = vmulps_avx512vl(auVar81,auVar74);
  auVar90 = vcvtdq2ps_avx512vl(auVar103);
  auVar91 = vcvtdq2ps_avx512vl(auVar100);
  auVar92 = vcvtdq2ps_avx512vl(auVar105);
  auVar93 = vcvtdq2ps_avx512vl(auVar106);
  auVar94 = vcvtdq2ps_avx512vl(auVar104);
  auVar103 = vcvtdq2ps_avx(auVar101);
  auVar105 = vcvtdq2ps_avx(auVar102);
  auVar106 = vcvtdq2ps_avx(auVar95);
  auVar104 = vcvtdq2ps_avx(auVar96);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(1));
  uVar166 = auVar74._0_4_;
  auVar110._4_4_ = uVar166;
  auVar110._0_4_ = uVar166;
  auVar110._8_4_ = uVar166;
  auVar110._12_4_ = uVar166;
  auVar110._16_4_ = uVar166;
  auVar110._20_4_ = uVar166;
  auVar110._24_4_ = uVar166;
  auVar110._28_4_ = uVar166;
  auVar96 = vpermps_avx512vl(auVar95,ZEXT1632(auVar74));
  auVar97 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar98 = vpermps_avx512vl(auVar97,ZEXT1632(auVar74));
  auVar99 = vmulps_avx512vl(auVar98,auVar92);
  auVar101._4_4_ = auVar98._4_4_ * auVar103._4_4_;
  auVar101._0_4_ = auVar98._0_4_ * auVar103._0_4_;
  auVar101._8_4_ = auVar98._8_4_ * auVar103._8_4_;
  auVar101._12_4_ = auVar98._12_4_ * auVar103._12_4_;
  auVar101._16_4_ = auVar98._16_4_ * auVar103._16_4_;
  auVar101._20_4_ = auVar98._20_4_ * auVar103._20_4_;
  auVar101._24_4_ = auVar98._24_4_ * auVar103._24_4_;
  auVar101._28_4_ = auVar100._28_4_;
  auVar102._4_4_ = auVar104._4_4_ * auVar98._4_4_;
  auVar102._0_4_ = auVar104._0_4_ * auVar98._0_4_;
  auVar102._8_4_ = auVar104._8_4_ * auVar98._8_4_;
  auVar102._12_4_ = auVar104._12_4_ * auVar98._12_4_;
  auVar102._16_4_ = auVar104._16_4_ * auVar98._16_4_;
  auVar102._20_4_ = auVar104._20_4_ * auVar98._20_4_;
  auVar102._24_4_ = auVar104._24_4_ * auVar98._24_4_;
  auVar102._28_4_ = auVar98._28_4_;
  auVar100 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar91);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar94);
  auVar74 = vfmadd231ps_fma(auVar102,auVar106,auVar96);
  auVar100 = vfmadd231ps_avx512vl(auVar100,auVar110,auVar90);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar110,auVar93);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar105,auVar110);
  auVar98._4_4_ = fVar270;
  auVar98._0_4_ = fVar270;
  auVar98._8_4_ = fVar270;
  auVar98._12_4_ = fVar270;
  auVar98._16_4_ = fVar270;
  auVar98._20_4_ = fVar270;
  auVar98._24_4_ = fVar270;
  auVar98._28_4_ = fVar270;
  auVar96 = ZEXT1632(CONCAT412(fVar2 * auVar75._12_4_,
                               CONCAT48(fVar2 * auVar75._8_4_,
                                        CONCAT44(fVar2 * auVar75._4_4_,fVar270))));
  auVar102 = vpermps_avx512vl(auVar95,auVar96);
  auVar97 = vpermps_avx512vl(auVar97,auVar96);
  auVar92 = vmulps_avx512vl(auVar97,auVar92);
  auVar95._4_4_ = auVar97._4_4_ * auVar103._4_4_;
  auVar95._0_4_ = auVar97._0_4_ * auVar103._0_4_;
  auVar95._8_4_ = auVar97._8_4_ * auVar103._8_4_;
  auVar95._12_4_ = auVar97._12_4_ * auVar103._12_4_;
  auVar95._16_4_ = auVar97._16_4_ * auVar103._16_4_;
  auVar95._20_4_ = auVar97._20_4_ * auVar103._20_4_;
  auVar95._24_4_ = auVar97._24_4_ * auVar103._24_4_;
  auVar95._28_4_ = uVar166;
  auVar96._4_4_ = auVar97._4_4_ * auVar104._4_4_;
  auVar96._0_4_ = auVar97._0_4_ * auVar104._0_4_;
  auVar96._8_4_ = auVar97._8_4_ * auVar104._8_4_;
  auVar96._12_4_ = auVar97._12_4_ * auVar104._12_4_;
  auVar96._16_4_ = auVar97._16_4_ * auVar104._16_4_;
  auVar96._20_4_ = auVar97._20_4_ * auVar104._20_4_;
  auVar96._24_4_ = auVar97._24_4_ * auVar104._24_4_;
  auVar96._28_4_ = auVar103._28_4_;
  auVar103 = vfmadd231ps_avx512vl(auVar92,auVar102,auVar91);
  auVar104 = vfmadd231ps_avx512vl(auVar95,auVar102,auVar94);
  auVar75 = vfmadd231ps_fma(auVar96,auVar102,auVar106);
  auVar102 = vfmadd231ps_avx512vl(auVar103,auVar98,auVar90);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar98,auVar93);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar98,auVar105);
  auVar93._8_4_ = 0x7fffffff;
  auVar93._0_8_ = 0x7fffffff7fffffff;
  auVar93._12_4_ = 0x7fffffff;
  auVar93._16_4_ = 0x7fffffff;
  auVar93._20_4_ = 0x7fffffff;
  auVar93._24_4_ = 0x7fffffff;
  auVar93._28_4_ = 0x7fffffff;
  auVar97._8_4_ = 0x219392ef;
  auVar97._0_8_ = 0x219392ef219392ef;
  auVar97._12_4_ = 0x219392ef;
  auVar97._16_4_ = 0x219392ef;
  auVar97._20_4_ = 0x219392ef;
  auVar97._24_4_ = 0x219392ef;
  auVar97._28_4_ = 0x219392ef;
  auVar103 = vandps_avx(auVar93,auVar100);
  uVar70 = vcmpps_avx512vl(auVar103,auVar97,1);
  bVar71 = (bool)((byte)uVar70 & 1);
  auVar90._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar100._0_4_;
  bVar71 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar100._4_4_;
  bVar71 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar100._8_4_;
  bVar71 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar100._12_4_;
  bVar71 = (bool)((byte)(uVar70 >> 4) & 1);
  auVar90._16_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar100._16_4_;
  bVar71 = (bool)((byte)(uVar70 >> 5) & 1);
  auVar90._20_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar100._20_4_;
  bVar71 = (bool)((byte)(uVar70 >> 6) & 1);
  auVar90._24_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar100._24_4_;
  bVar71 = SUB81(uVar70 >> 7,0);
  auVar90._28_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar100._28_4_;
  auVar103 = vandps_avx(auVar93,auVar101);
  uVar70 = vcmpps_avx512vl(auVar103,auVar97,1);
  bVar71 = (bool)((byte)uVar70 & 1);
  auVar91._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar101._0_4_;
  bVar71 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar101._4_4_;
  bVar71 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar101._8_4_;
  bVar71 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar101._12_4_;
  bVar71 = (bool)((byte)(uVar70 >> 4) & 1);
  auVar91._16_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar101._16_4_;
  bVar71 = (bool)((byte)(uVar70 >> 5) & 1);
  auVar91._20_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar101._20_4_;
  bVar71 = (bool)((byte)(uVar70 >> 6) & 1);
  auVar91._24_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar101._24_4_;
  bVar71 = SUB81(uVar70 >> 7,0);
  auVar91._28_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar101._28_4_;
  auVar103 = vandps_avx(auVar93,ZEXT1632(auVar74));
  uVar70 = vcmpps_avx512vl(auVar103,auVar97,1);
  bVar71 = (bool)((byte)uVar70 & 1);
  auVar103._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar74._0_4_;
  bVar71 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar74._4_4_;
  bVar71 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar74._8_4_;
  bVar71 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar74._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  auVar105 = vrcp14ps_avx512vl(auVar90);
  auVar94._8_4_ = 0x3f800000;
  auVar94._0_8_ = 0x3f8000003f800000;
  auVar94._12_4_ = 0x3f800000;
  auVar94._16_4_ = 0x3f800000;
  auVar94._20_4_ = 0x3f800000;
  auVar94._24_4_ = 0x3f800000;
  auVar94._28_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar90,auVar105,auVar94);
  auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar105,auVar105);
  auVar105 = vrcp14ps_avx512vl(auVar91);
  auVar74 = vfnmadd213ps_fma(auVar91,auVar105,auVar94);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar105,auVar105);
  auVar105 = vrcp14ps_avx512vl(auVar103);
  auVar77 = vfnmadd213ps_fma(auVar103,auVar105,auVar94);
  auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar105,auVar105);
  auVar92._4_4_ = fVar228;
  auVar92._0_4_ = fVar228;
  auVar92._8_4_ = fVar228;
  auVar92._12_4_ = fVar228;
  auVar92._16_4_ = fVar228;
  auVar92._20_4_ = fVar228;
  auVar92._24_4_ = fVar228;
  auVar92._28_4_ = fVar228;
  auVar103 = vcvtdq2ps_avx(auVar107);
  auVar105 = vcvtdq2ps_avx(auVar108);
  auVar105 = vsubps_avx(auVar105,auVar103);
  auVar78 = vfmadd213ps_fma(auVar105,auVar92,auVar103);
  auVar103 = vcvtdq2ps_avx(auVar109);
  auVar105 = vcvtdq2ps_avx512vl(auVar87);
  auVar105 = vsubps_avx(auVar105,auVar103);
  auVar85 = vfmadd213ps_fma(auVar105,auVar92,auVar103);
  auVar105 = vcvtdq2ps_avx512vl(auVar88);
  auVar103 = vcvtdq2ps_avx512vl(auVar89);
  auVar103 = vsubps_avx(auVar103,auVar105);
  auVar3 = vfmadd213ps_fma(auVar103,auVar92,auVar105);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x14 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x18 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar103);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x1d + 6));
  auVar76 = vfmadd213ps_fma(auVar105,auVar92,auVar103);
  auVar103 = vcvtdq2ps_avx(auVar106);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x21 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar103);
  auVar79 = vfmadd213ps_fma(auVar105,auVar92,auVar103);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x1f + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x23 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar103);
  auVar80 = vfmadd213ps_fma(auVar105,auVar92,auVar103);
  auVar103 = vsubps_avx512vl(ZEXT1632(auVar78),auVar102);
  auVar107._4_4_ = auVar75._4_4_ * auVar103._4_4_;
  auVar107._0_4_ = auVar75._0_4_ * auVar103._0_4_;
  auVar107._8_4_ = auVar75._8_4_ * auVar103._8_4_;
  auVar107._12_4_ = auVar75._12_4_ * auVar103._12_4_;
  auVar107._16_4_ = auVar103._16_4_ * 0.0;
  auVar107._20_4_ = auVar103._20_4_ * 0.0;
  auVar107._24_4_ = auVar103._24_4_ * 0.0;
  auVar107._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx512vl(ZEXT1632(auVar85),auVar102);
  auVar89._0_4_ = auVar75._0_4_ * auVar103._0_4_;
  auVar89._4_4_ = auVar75._4_4_ * auVar103._4_4_;
  auVar89._8_4_ = auVar75._8_4_ * auVar103._8_4_;
  auVar89._12_4_ = auVar75._12_4_ * auVar103._12_4_;
  auVar89._16_4_ = auVar103._16_4_ * 0.0;
  auVar89._20_4_ = auVar103._20_4_ * 0.0;
  auVar89._24_4_ = auVar103._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar103 = vsubps_avx(ZEXT1632(auVar3),auVar104);
  auVar108._4_4_ = auVar74._4_4_ * auVar103._4_4_;
  auVar108._0_4_ = auVar74._0_4_ * auVar103._0_4_;
  auVar108._8_4_ = auVar74._8_4_ * auVar103._8_4_;
  auVar108._12_4_ = auVar74._12_4_ * auVar103._12_4_;
  auVar108._16_4_ = auVar103._16_4_ * 0.0;
  auVar108._20_4_ = auVar103._20_4_ * 0.0;
  auVar108._24_4_ = auVar103._24_4_ * 0.0;
  auVar108._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar76),auVar104);
  auVar88._0_4_ = auVar74._0_4_ * auVar103._0_4_;
  auVar88._4_4_ = auVar74._4_4_ * auVar103._4_4_;
  auVar88._8_4_ = auVar74._8_4_ * auVar103._8_4_;
  auVar88._12_4_ = auVar74._12_4_ * auVar103._12_4_;
  auVar88._16_4_ = auVar103._16_4_ * 0.0;
  auVar88._20_4_ = auVar103._20_4_ * 0.0;
  auVar88._24_4_ = auVar103._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar103 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar81));
  auVar109._4_4_ = auVar77._4_4_ * auVar103._4_4_;
  auVar109._0_4_ = auVar77._0_4_ * auVar103._0_4_;
  auVar109._8_4_ = auVar77._8_4_ * auVar103._8_4_;
  auVar109._12_4_ = auVar77._12_4_ * auVar103._12_4_;
  auVar109._16_4_ = auVar103._16_4_ * 0.0;
  auVar109._20_4_ = auVar103._20_4_ * 0.0;
  auVar109._24_4_ = auVar103._24_4_ * 0.0;
  auVar109._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar81));
  auVar87._0_4_ = auVar77._0_4_ * auVar103._0_4_;
  auVar87._4_4_ = auVar77._4_4_ * auVar103._4_4_;
  auVar87._8_4_ = auVar77._8_4_ * auVar103._8_4_;
  auVar87._12_4_ = auVar77._12_4_ * auVar103._12_4_;
  auVar87._16_4_ = auVar103._16_4_ * 0.0;
  auVar87._20_4_ = auVar103._20_4_ * 0.0;
  auVar87._24_4_ = auVar103._24_4_ * 0.0;
  auVar87._28_4_ = 0;
  auVar103 = vpminsd_avx2(auVar107,auVar89);
  auVar105 = vpminsd_avx2(auVar108,auVar88);
  auVar103 = vmaxps_avx(auVar103,auVar105);
  auVar105 = vpminsd_avx2(auVar109,auVar87);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar106._4_4_ = uVar166;
  auVar106._0_4_ = uVar166;
  auVar106._8_4_ = uVar166;
  auVar106._12_4_ = uVar166;
  auVar106._16_4_ = uVar166;
  auVar106._20_4_ = uVar166;
  auVar106._24_4_ = uVar166;
  auVar106._28_4_ = uVar166;
  auVar105 = vmaxps_avx512vl(auVar105,auVar106);
  auVar103 = vmaxps_avx(auVar103,auVar105);
  auVar105._8_4_ = 0x3f7ffffa;
  auVar105._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar105._12_4_ = 0x3f7ffffa;
  auVar105._16_4_ = 0x3f7ffffa;
  auVar105._20_4_ = 0x3f7ffffa;
  auVar105._24_4_ = 0x3f7ffffa;
  auVar105._28_4_ = 0x3f7ffffa;
  local_340 = vmulps_avx512vl(auVar103,auVar105);
  auVar103 = vpmaxsd_avx2(auVar107,auVar89);
  auVar105 = vpmaxsd_avx2(auVar108,auVar88);
  auVar103 = vminps_avx(auVar103,auVar105);
  auVar105 = vpmaxsd_avx2(auVar109,auVar87);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar104._4_4_ = uVar166;
  auVar104._0_4_ = uVar166;
  auVar104._8_4_ = uVar166;
  auVar104._12_4_ = uVar166;
  auVar104._16_4_ = uVar166;
  auVar104._20_4_ = uVar166;
  auVar104._24_4_ = uVar166;
  auVar104._28_4_ = uVar166;
  auVar105 = vminps_avx512vl(auVar105,auVar104);
  auVar103 = vminps_avx(auVar103,auVar105);
  auVar100._8_4_ = 0x3f800003;
  auVar100._0_8_ = 0x3f8000033f800003;
  auVar100._12_4_ = 0x3f800003;
  auVar100._16_4_ = 0x3f800003;
  auVar100._20_4_ = 0x3f800003;
  auVar100._24_4_ = 0x3f800003;
  auVar100._28_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar100);
  uVar18 = vcmpps_avx512vl(local_340,auVar103,2);
  uVar20 = vpcmpgtd_avx512vl(auVar86,_DAT_01fb4ba0);
  local_6a8 = (ulong)(byte)((byte)uVar18 & (byte)uVar20);
  local_540 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6b0 = prim;
LAB_01ba0239:
  if (local_6a8 == 0) {
LAB_01ba2c63:
    return local_6a8 != 0;
  }
  lVar64 = 0;
  for (uVar70 = local_6a8; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
    lVar64 = lVar64 + 1;
  }
  uVar4 = *(uint *)(local_6b0 + 2);
  pGVar5 = (context->scene->geometries).items[uVar4].ptr;
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)*(uint *)(local_6b0 + lVar64 * 4 + 6) *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar2 = (pGVar5->time_range).lower;
  fVar2 = pGVar5->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar2) / ((pGVar5->time_range).upper - fVar2));
  auVar75 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
  auVar75 = vminss_avx(auVar75,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar75 = vmaxss_avx(ZEXT816(0) << 0x20,auVar75);
  fVar2 = fVar2 - auVar75._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar69 = (long)(int)auVar75._0_4_ * 0x38;
  lVar64 = *(long *)(_Var6 + 0x10 + lVar69);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar69);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar69);
  pfVar1 = (float *)(lVar7 + uVar70 * lVar8);
  auVar167._0_4_ = fVar2 * *pfVar1;
  auVar167._4_4_ = fVar2 * pfVar1[1];
  auVar167._8_4_ = fVar2 * pfVar1[2];
  auVar167._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar70 + 1) * lVar8);
  auVar185._0_4_ = fVar2 * *pfVar1;
  auVar185._4_4_ = fVar2 * pfVar1[1];
  auVar185._8_4_ = fVar2 * pfVar1[2];
  auVar185._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar70 + 2) * lVar8);
  auVar84._0_4_ = fVar2 * *pfVar1;
  auVar84._4_4_ = fVar2 * pfVar1[1];
  auVar84._8_4_ = fVar2 * pfVar1[2];
  auVar84._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar70 + 3));
  auVar229._0_4_ = fVar2 * *pfVar1;
  auVar229._4_4_ = fVar2 * pfVar1[1];
  auVar229._8_4_ = fVar2 * pfVar1[2];
  auVar229._12_4_ = fVar2 * pfVar1[3];
  local_4e0 = vpbroadcastd_avx512vl();
  lVar7 = *(long *)(_Var6 + lVar69);
  fVar2 = 1.0 - fVar2;
  auVar83._4_4_ = fVar2;
  auVar83._0_4_ = fVar2;
  auVar83._8_4_ = fVar2;
  auVar83._12_4_ = fVar2;
  auVar77 = vfmadd231ps_fma(auVar167,auVar83,*(undefined1 (*) [16])(lVar7 + lVar64 * uVar70));
  auVar78 = vfmadd231ps_fma(auVar185,auVar83,*(undefined1 (*) [16])(lVar7 + lVar64 * (uVar70 + 1)));
  auVar85 = vfmadd231ps_fma(auVar84,auVar83,*(undefined1 (*) [16])(lVar7 + lVar64 * (uVar70 + 2)));
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar74 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar268._4_4_ = uVar166;
  auVar268._0_4_ = uVar166;
  auVar268._8_4_ = uVar166;
  auVar268._12_4_ = uVar166;
  local_5e0._16_4_ = uVar166;
  local_5e0._0_16_ = auVar268;
  local_5e0._20_4_ = uVar166;
  local_5e0._24_4_ = uVar166;
  local_5e0._28_4_ = uVar166;
  uVar166 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar269._4_4_ = uVar166;
  auVar269._0_4_ = uVar166;
  auVar269._8_4_ = uVar166;
  auVar269._12_4_ = uVar166;
  local_600._16_4_ = uVar166;
  local_600._0_16_ = auVar269;
  local_600._20_4_ = uVar166;
  local_600._24_4_ = uVar166;
  local_600._28_4_ = uVar166;
  auVar75 = vunpcklps_avx(auVar268,auVar269);
  local_620 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar79 = local_620._0_16_;
  local_7d0 = vinsertps_avx512f(auVar75,auVar79,0x28);
  auVar262 = ZEXT1664(local_7d0);
  auVar242._0_4_ = auVar77._0_4_ + auVar78._0_4_;
  auVar242._4_4_ = auVar77._4_4_ + auVar78._4_4_;
  auVar242._8_4_ = auVar77._8_4_ + auVar78._8_4_;
  auVar242._12_4_ = auVar77._12_4_ + auVar78._12_4_;
  auVar82._8_4_ = 0x3f000000;
  auVar82._0_8_ = 0x3f0000003f000000;
  auVar82._12_4_ = 0x3f000000;
  local_260._16_16_ = local_620._16_16_;
  auVar75 = vmulps_avx512vl(auVar242,auVar82);
  auVar75 = vsubps_avx(auVar75,auVar74);
  auVar75 = vdpps_avx(auVar75,local_7d0,0x7f);
  fVar2 = *(float *)(ray + k * 4 + 0x60);
  auVar263 = ZEXT464((uint)fVar2);
  local_7e0 = vdpps_avx(local_7d0,local_7d0,0x7f);
  auVar248._4_12_ = ZEXT812(0) << 0x20;
  auVar248._0_4_ = local_7e0._0_4_;
  auVar76 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar248);
  auVar3 = vfnmadd213ss_fma(auVar76,local_7e0,ZEXT416(0x40000000));
  local_320 = auVar75._0_4_ * auVar3._0_4_ * auVar76._0_4_;
  auVar249._4_4_ = local_320;
  auVar249._0_4_ = local_320;
  auVar249._8_4_ = local_320;
  auVar249._12_4_ = local_320;
  fStack_5b0 = local_320;
  _local_5c0 = auVar249;
  fStack_5ac = local_320;
  fStack_5a8 = local_320;
  fStack_5a4 = local_320;
  auVar75 = vfmadd231ps_fma(auVar74,local_7d0,auVar249);
  auVar75 = vblendps_avx(auVar75,ZEXT816(0) << 0x40,8);
  auVar74 = vsubps_avx(auVar77,auVar75);
  auVar253 = ZEXT1664(auVar74);
  auVar77 = vsubps_avx(auVar85,auVar75);
  auVar85 = vfmadd231ps_fma(auVar229,auVar83,*(undefined1 (*) [16])(lVar7 + lVar64 * (uVar70 + 3)));
  auVar78 = vsubps_avx(auVar78,auVar75);
  auVar258 = ZEXT1664(auVar78);
  auVar75 = vsubps_avx(auVar85,auVar75);
  auVar241 = ZEXT3264(_DAT_01f7b040);
  auVar103 = vbroadcastss_avx512vl(auVar74);
  auVar271 = ZEXT3264(auVar103);
  auVar99._8_4_ = 1;
  auVar99._0_8_ = 0x100000001;
  auVar99._12_4_ = 1;
  auVar99._16_4_ = 1;
  auVar99._20_4_ = 1;
  auVar99._24_4_ = 1;
  auVar99._28_4_ = 1;
  local_760 = ZEXT1632(auVar74);
  auVar105 = vpermps_avx512vl(auVar99,local_760);
  auVar272 = ZEXT3264(auVar105);
  auVar111._8_4_ = 2;
  auVar111._0_8_ = 0x200000002;
  auVar111._12_4_ = 2;
  auVar111._16_4_ = 2;
  auVar111._20_4_ = 2;
  auVar111._24_4_ = 2;
  auVar111._28_4_ = 2;
  auVar106 = vpermps_avx512vl(auVar111,local_760);
  auVar112._8_4_ = 3;
  auVar112._0_8_ = 0x300000003;
  auVar112._12_4_ = 3;
  auVar112._16_4_ = 3;
  auVar112._20_4_ = 3;
  auVar112._24_4_ = 3;
  auVar112._28_4_ = 3;
  auVar104 = vpermps_avx512vl(auVar112,local_760);
  auVar100 = vbroadcastss_avx512vl(auVar78);
  local_7a0 = ZEXT1632(auVar78);
  auVar101 = vpermps_avx512vl(auVar99,local_7a0);
  auVar102 = vpermps_avx512vl(auVar111,local_7a0);
  auVar95 = vpermps_avx512vl(auVar112,local_7a0);
  auVar96 = vbroadcastss_avx512vl(auVar77);
  local_780 = ZEXT1632(auVar77);
  auVar107 = vpermps_avx512vl(auVar99,local_780);
  local_280 = vpermps_avx512vl(auVar111,local_780);
  local_2a0 = vpermps_avx512vl(auVar112,local_780);
  local_2c0 = vbroadcastss_avx512vl(auVar75);
  _local_7c0 = ZEXT1632(auVar75);
  local_2e0 = vpermps_avx2(auVar99,_local_7c0);
  local_300 = vpermps_avx2(auVar111,_local_7c0);
  local_220 = vpermps_avx2(auVar112,_local_7c0);
  local_260._0_16_ = vmulss_avx512f(auVar79,auVar79);
  auVar75 = vfmadd231ps_fma(ZEXT1632(local_260._0_16_),local_600,local_600);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),local_5e0,local_5e0);
  local_240._0_4_ = auVar75._0_4_;
  local_240._4_4_ = local_240._0_4_;
  local_240._8_4_ = local_240._0_4_;
  local_240._12_4_ = local_240._0_4_;
  local_240._16_4_ = local_240._0_4_;
  local_240._20_4_ = local_240._0_4_;
  local_240._24_4_ = local_240._0_4_;
  local_240._28_4_ = local_240._0_4_;
  auVar86._8_4_ = 0x7fffffff;
  auVar86._0_8_ = 0x7fffffff7fffffff;
  auVar86._12_4_ = 0x7fffffff;
  auVar86._16_4_ = 0x7fffffff;
  auVar86._20_4_ = 0x7fffffff;
  auVar86._24_4_ = 0x7fffffff;
  auVar86._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_240,auVar86);
  local_6f0 = ZEXT416((uint)local_320);
  local_320 = fVar2 - local_320;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  uVar70 = 0;
  bVar63 = 0;
  local_acc = 1;
  local_500 = vpbroadcastd_avx512vl();
  auVar75 = vsqrtss_avx(local_7e0,local_7e0);
  auVar74 = vsqrtss_avx(local_7e0,local_7e0);
  local_550 = ZEXT816(0x3f80000000000000);
  auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar273 = ZEXT3264(auVar108);
  do {
    auVar77 = vmovshdup_avx(local_550);
    auVar77 = vsubps_avx(auVar77,local_550);
    auVar149._0_4_ = auVar77._0_4_;
    fVar228 = auVar149._0_4_ * 0.04761905;
    uVar166 = local_550._0_4_;
    auVar232._4_4_ = uVar166;
    auVar232._0_4_ = uVar166;
    auVar232._8_4_ = uVar166;
    auVar232._12_4_ = uVar166;
    auVar232._16_4_ = uVar166;
    auVar232._20_4_ = uVar166;
    auVar232._24_4_ = uVar166;
    auVar232._28_4_ = uVar166;
    auVar149._4_4_ = auVar149._0_4_;
    auVar149._8_4_ = auVar149._0_4_;
    auVar149._12_4_ = auVar149._0_4_;
    auVar158._16_4_ = auVar149._0_4_;
    auVar158._0_16_ = auVar149;
    auVar158._20_4_ = auVar149._0_4_;
    auVar158._24_4_ = auVar149._0_4_;
    auVar158._28_4_ = auVar149._0_4_;
    auVar77 = vfmadd231ps_fma(auVar232,auVar158,auVar241._0_32_);
    auVar108 = vsubps_avx512vl(auVar273._0_32_,ZEXT1632(auVar77));
    fVar270 = auVar77._0_4_;
    fVar222 = auVar77._4_4_;
    fVar223 = auVar77._8_4_;
    fVar224 = auVar77._12_4_;
    fVar226 = auVar108._0_4_;
    fVar227 = auVar108._4_4_;
    fVar244 = auVar108._8_4_;
    fVar245 = auVar108._12_4_;
    fVar246 = auVar108._16_4_;
    fVar184 = auVar108._20_4_;
    fVar247 = auVar108._24_4_;
    auVar116._4_4_ = fVar227 * fVar227 * -fVar222;
    auVar116._0_4_ = fVar226 * fVar226 * -fVar270;
    auVar116._8_4_ = fVar244 * fVar244 * -fVar223;
    auVar116._12_4_ = fVar245 * fVar245 * -fVar224;
    auVar116._16_4_ = fVar246 * fVar246 * -0.0;
    auVar116._20_4_ = fVar184 * fVar184 * -0.0;
    auVar116._24_4_ = fVar247 * fVar247 * -0.0;
    auVar116._28_4_ = 0x80000000;
    auVar241._28_36_ = auVar253._28_36_;
    auVar241._0_28_ =
         ZEXT1628(CONCAT412(fVar224 * fVar224,
                            CONCAT48(fVar223 * fVar223,CONCAT44(fVar222 * fVar222,fVar270 * fVar270)
                                    )));
    fVar254 = fVar270 * 3.0;
    fVar259 = fVar222 * 3.0;
    fVar260 = fVar223 * 3.0;
    fVar261 = fVar224 * 3.0;
    auVar253._28_36_ = auVar258._28_36_;
    auVar253._0_28_ = ZEXT1628(CONCAT412(fVar261,CONCAT48(fVar260,CONCAT44(fVar259,fVar254))));
    auVar179._0_4_ = (fVar254 + -5.0) * fVar270 * fVar270;
    auVar179._4_4_ = (fVar259 + -5.0) * fVar222 * fVar222;
    auVar179._8_4_ = (fVar260 + -5.0) * fVar223 * fVar223;
    auVar179._12_4_ = (fVar261 + -5.0) * fVar224 * fVar224;
    auVar179._16_4_ = 0x80000000;
    auVar179._20_4_ = 0x80000000;
    auVar179._24_4_ = 0x80000000;
    auVar179._28_4_ = 0;
    auVar109 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar86 = vaddps_avx512vl(auVar179,auVar109);
    auVar273._0_4_ = fVar226 * fVar226;
    auVar273._4_4_ = fVar227 * fVar227;
    auVar273._8_4_ = fVar244 * fVar244;
    auVar273._12_4_ = fVar245 * fVar245;
    auVar273._16_4_ = fVar246 * fVar246;
    auVar273._20_4_ = fVar184 * fVar184;
    auVar273._28_36_ = auVar262._28_36_;
    auVar273._24_4_ = fVar247 * fVar247;
    auVar119._4_4_ = auVar273._4_4_ * (fVar227 * 3.0 + -5.0);
    auVar119._0_4_ = auVar273._0_4_ * (fVar226 * 3.0 + -5.0);
    auVar119._8_4_ = auVar273._8_4_ * (fVar244 * 3.0 + -5.0);
    auVar119._12_4_ = auVar273._12_4_ * (fVar245 * 3.0 + -5.0);
    auVar119._16_4_ = auVar273._16_4_ * (fVar246 * 3.0 + -5.0);
    auVar119._20_4_ = auVar273._20_4_ * (fVar184 * 3.0 + -5.0);
    auVar119._24_4_ = auVar273._24_4_ * (fVar247 * 3.0 + -5.0);
    auVar119._28_4_ = auVar263._28_4_ + -5.0;
    auVar87 = vaddps_avx512vl(auVar119,auVar109);
    fVar225 = auVar108._28_4_;
    auVar120._4_4_ = fVar222 * fVar222 * -fVar227;
    auVar120._0_4_ = fVar270 * fVar270 * -fVar226;
    auVar120._8_4_ = fVar223 * fVar223 * -fVar244;
    auVar120._12_4_ = fVar224 * fVar224 * -fVar245;
    auVar120._16_4_ = -fVar246 * 0.0 * 0.0;
    auVar120._20_4_ = -fVar184 * 0.0 * 0.0;
    auVar120._24_4_ = -fVar247 * 0.0 * 0.0;
    auVar120._28_4_ = -fVar225;
    auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar108 = vmulps_avx512vl(auVar116,auVar88);
    auVar89 = vmulps_avx512vl(auVar86,auVar88);
    auVar87 = vmulps_avx512vl(auVar87,auVar88);
    auVar90 = vmulps_avx512vl(auVar120,auVar88);
    auVar91 = vmulps_avx512vl(local_2c0,auVar90);
    auVar121._4_4_ = local_2e0._4_4_ * auVar90._4_4_;
    auVar121._0_4_ = local_2e0._0_4_ * auVar90._0_4_;
    auVar121._8_4_ = local_2e0._8_4_ * auVar90._8_4_;
    auVar121._12_4_ = local_2e0._12_4_ * auVar90._12_4_;
    auVar121._16_4_ = local_2e0._16_4_ * auVar90._16_4_;
    auVar121._20_4_ = local_2e0._20_4_ * auVar90._20_4_;
    auVar121._24_4_ = local_2e0._24_4_ * auVar90._24_4_;
    auVar121._28_4_ = auVar86._28_4_;
    auVar122._4_4_ = local_300._4_4_ * auVar90._4_4_;
    auVar122._0_4_ = local_300._0_4_ * auVar90._0_4_;
    auVar122._8_4_ = local_300._8_4_ * auVar90._8_4_;
    auVar122._12_4_ = local_300._12_4_ * auVar90._12_4_;
    auVar122._16_4_ = local_300._16_4_ * auVar90._16_4_;
    auVar122._20_4_ = local_300._20_4_ * auVar90._20_4_;
    auVar122._24_4_ = local_300._24_4_ * auVar90._24_4_;
    auVar122._28_4_ = 0x80000000;
    auVar86 = vmulps_avx512vl(local_220,auVar90);
    auVar90 = vfmadd231ps_avx512vl(auVar91,auVar87,auVar96);
    auVar91 = vfmadd231ps_avx512vl(auVar121,auVar87,auVar107);
    auVar92 = vfmadd231ps_avx512vl(auVar122,auVar87,local_280);
    auVar86 = vfmadd231ps_avx512vl(auVar86,local_2a0,auVar87);
    auVar87 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar100);
    auVar90 = vfmadd231ps_avx512vl(auVar91,auVar89,auVar101);
    auVar91 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar102);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar95,auVar89);
    auVar92 = vfmadd231ps_avx512vl(auVar87,auVar108,auVar271._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar108,auVar272._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,auVar106);
    auVar87 = vfmadd231ps_avx512vl(auVar86,auVar104,auVar108);
    auVar123._4_4_ = (fVar227 + fVar227) * fVar222;
    auVar123._0_4_ = (fVar226 + fVar226) * fVar270;
    auVar123._8_4_ = (fVar244 + fVar244) * fVar223;
    auVar123._12_4_ = (fVar245 + fVar245) * fVar224;
    auVar123._16_4_ = (fVar246 + fVar246) * 0.0;
    auVar123._20_4_ = (fVar184 + fVar184) * 0.0;
    auVar123._24_4_ = (fVar247 + fVar247) * 0.0;
    auVar123._28_4_ = auVar89._28_4_;
    auVar108 = vsubps_avx(auVar123,auVar273._0_32_);
    auVar233._0_28_ =
         ZEXT1628(CONCAT412((fVar224 + fVar224) * (fVar261 + -5.0) + fVar261 * fVar224,
                            CONCAT48((fVar223 + fVar223) * (fVar260 + -5.0) + fVar260 * fVar223,
                                     CONCAT44((fVar222 + fVar222) * (fVar259 + -5.0) +
                                              fVar259 * fVar222,
                                              (fVar270 + fVar270) * (fVar254 + -5.0) +
                                              fVar254 * fVar270))));
    auVar233._28_4_ = auVar258._28_4_ + -5.0 + 0.0;
    auVar109 = vaddps_avx512vl(auVar253._0_32_,auVar109);
    auVar126._4_4_ = (fVar227 + fVar227) * auVar109._4_4_;
    auVar126._0_4_ = (fVar226 + fVar226) * auVar109._0_4_;
    auVar126._8_4_ = (fVar244 + fVar244) * auVar109._8_4_;
    auVar126._12_4_ = (fVar245 + fVar245) * auVar109._12_4_;
    auVar126._16_4_ = (fVar246 + fVar246) * auVar109._16_4_;
    auVar126._20_4_ = (fVar184 + fVar184) * auVar109._20_4_;
    auVar126._24_4_ = (fVar247 + fVar247) * auVar109._24_4_;
    auVar126._28_4_ = auVar109._28_4_;
    auVar127._4_4_ = fVar227 * 3.0 * fVar227;
    auVar127._0_4_ = fVar226 * 3.0 * fVar226;
    auVar127._8_4_ = fVar244 * 3.0 * fVar244;
    auVar127._12_4_ = fVar245 * 3.0 * fVar245;
    auVar127._16_4_ = fVar246 * 3.0 * fVar246;
    auVar127._20_4_ = fVar184 * 3.0 * fVar184;
    auVar127._24_4_ = fVar247 * 3.0 * fVar247;
    auVar127._28_4_ = fVar225;
    auVar109 = vsubps_avx(auVar126,auVar127);
    auVar86 = vsubps_avx(auVar241._0_32_,auVar123);
    auVar93 = vmulps_avx512vl(auVar108,auVar88);
    auVar94 = vmulps_avx512vl(auVar233,auVar88);
    auVar109 = vmulps_avx512vl(auVar109,auVar88);
    auVar86 = vmulps_avx512vl(auVar86,auVar88);
    auVar88 = vmulps_avx512vl(local_2c0,auVar86);
    auVar128._4_4_ = local_2e0._4_4_ * auVar86._4_4_;
    auVar128._0_4_ = local_2e0._0_4_ * auVar86._0_4_;
    auVar128._8_4_ = local_2e0._8_4_ * auVar86._8_4_;
    auVar128._12_4_ = local_2e0._12_4_ * auVar86._12_4_;
    auVar128._16_4_ = local_2e0._16_4_ * auVar86._16_4_;
    auVar128._20_4_ = local_2e0._20_4_ * auVar86._20_4_;
    auVar128._24_4_ = local_2e0._24_4_ * auVar86._24_4_;
    auVar128._28_4_ = auVar108._28_4_;
    auVar38._4_4_ = local_300._4_4_ * auVar86._4_4_;
    auVar38._0_4_ = local_300._0_4_ * auVar86._0_4_;
    auVar38._8_4_ = local_300._8_4_ * auVar86._8_4_;
    auVar38._12_4_ = local_300._12_4_ * auVar86._12_4_;
    auVar38._16_4_ = local_300._16_4_ * auVar86._16_4_;
    auVar38._20_4_ = local_300._20_4_ * auVar86._20_4_;
    auVar38._24_4_ = local_300._24_4_ * auVar86._24_4_;
    auVar38._28_4_ = auVar263._28_4_;
    auVar108 = vmulps_avx512vl(local_220,auVar86);
    auVar86 = vfmadd231ps_avx512vl(auVar88,auVar109,auVar96);
    auVar88 = vfmadd231ps_avx512vl(auVar128,auVar109,auVar107);
    auVar97 = vfmadd231ps_avx512vl(auVar38,auVar109,local_280);
    auVar108 = vfmadd231ps_avx512vl(auVar108,local_2a0,auVar109);
    auVar109 = vfmadd231ps_avx512vl(auVar86,auVar94,auVar100);
    auVar86 = vfmadd231ps_avx512vl(auVar88,auVar94,auVar101);
    auVar88 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar102);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar95,auVar94);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar93,auVar271._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar93,auVar272._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar93);
    auVar39._4_4_ = auVar109._4_4_ * fVar228;
    auVar39._0_4_ = auVar109._0_4_ * fVar228;
    auVar39._8_4_ = auVar109._8_4_ * fVar228;
    auVar39._12_4_ = auVar109._12_4_ * fVar228;
    auVar39._16_4_ = auVar109._16_4_ * fVar228;
    auVar39._20_4_ = auVar109._20_4_ * fVar228;
    auVar39._24_4_ = auVar109._24_4_ * fVar228;
    auVar39._28_4_ = fVar225 + fVar225;
    auVar40._4_4_ = auVar86._4_4_ * fVar228;
    auVar40._0_4_ = auVar86._0_4_ * fVar228;
    auVar40._8_4_ = auVar86._8_4_ * fVar228;
    auVar40._12_4_ = auVar86._12_4_ * fVar228;
    auVar40._16_4_ = auVar86._16_4_ * fVar228;
    auVar40._20_4_ = auVar86._20_4_ * fVar228;
    auVar40._24_4_ = auVar86._24_4_ * fVar228;
    auVar40._28_4_ = auVar89._28_4_;
    auVar41._4_4_ = auVar88._4_4_ * fVar228;
    auVar41._0_4_ = auVar88._0_4_ * fVar228;
    auVar41._8_4_ = auVar88._8_4_ * fVar228;
    auVar41._12_4_ = auVar88._12_4_ * fVar228;
    auVar41._16_4_ = auVar88._16_4_ * fVar228;
    auVar41._20_4_ = auVar88._20_4_ * fVar228;
    auVar41._24_4_ = auVar88._24_4_ * fVar228;
    auVar41._28_4_ = 0;
    fVar270 = fVar228 * auVar108._0_4_;
    fVar222 = fVar228 * auVar108._4_4_;
    auVar42._4_4_ = fVar222;
    auVar42._0_4_ = fVar270;
    fVar223 = fVar228 * auVar108._8_4_;
    auVar42._8_4_ = fVar223;
    fVar224 = fVar228 * auVar108._12_4_;
    auVar42._12_4_ = fVar224;
    fVar225 = fVar228 * auVar108._16_4_;
    auVar42._16_4_ = fVar225;
    fVar226 = fVar228 * auVar108._20_4_;
    auVar42._20_4_ = fVar226;
    fVar227 = fVar228 * auVar108._24_4_;
    auVar42._24_4_ = fVar227;
    auVar42._28_4_ = fVar228;
    auVar77 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
    auVar89 = vpermt2ps_avx512vl(auVar92,_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar93 = vpermt2ps_avx512vl(auVar90,_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar262 = ZEXT3264(auVar93);
    auVar86 = ZEXT1632(auVar77);
    auVar94 = vpermt2ps_avx512vl(auVar91,_DAT_01fb9fc0,auVar86);
    auVar263 = ZEXT3264(auVar94);
    auVar234._0_4_ = auVar87._0_4_ + fVar270;
    auVar234._4_4_ = auVar87._4_4_ + fVar222;
    auVar234._8_4_ = auVar87._8_4_ + fVar223;
    auVar234._12_4_ = auVar87._12_4_ + fVar224;
    auVar234._16_4_ = auVar87._16_4_ + fVar225;
    auVar234._20_4_ = auVar87._20_4_ + fVar226;
    auVar234._24_4_ = auVar87._24_4_ + fVar227;
    auVar234._28_4_ = auVar87._28_4_ + fVar228;
    auVar108 = vmaxps_avx(auVar87,auVar234);
    auVar109 = vminps_avx(auVar87,auVar234);
    auVar97 = vpermt2ps_avx512vl(auVar87,_DAT_01fb9fc0,auVar86);
    auVar98 = vpermt2ps_avx512vl(auVar39,_DAT_01fb9fc0,auVar86);
    auVar99 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9fc0,auVar86);
    auVar122 = ZEXT1632(auVar77);
    auVar110 = vpermt2ps_avx512vl(auVar41,_DAT_01fb9fc0,auVar122);
    auVar86 = vpermt2ps_avx512vl(auVar42,_DAT_01fb9fc0,auVar122);
    auVar111 = vsubps_avx512vl(auVar97,auVar86);
    auVar86 = vsubps_avx(auVar89,auVar92);
    auVar258 = ZEXT3264(auVar86);
    auVar87 = vsubps_avx(auVar93,auVar90);
    auVar253 = ZEXT3264(auVar87);
    auVar88 = vsubps_avx(auVar94,auVar91);
    auVar112 = vmulps_avx512vl(auVar87,auVar41);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar40,auVar88);
    auVar113 = vmulps_avx512vl(auVar88,auVar39);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar41,auVar86);
    auVar114 = vmulps_avx512vl(auVar86,auVar40);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar39,auVar87);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar113 = vmulps_avx512vl(auVar88,auVar88);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar87,auVar87);
    auVar115 = vfmadd231ps_avx512vl(auVar113,auVar86,auVar86);
    auVar113 = vrcp14ps_avx512vl(auVar115);
    auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar273 = ZEXT3264(auVar116);
    auVar114 = vfnmadd213ps_avx512vl(auVar113,auVar115,auVar116);
    auVar113 = vfmadd132ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vmulps_avx512vl(auVar112,auVar113);
    auVar114 = vmulps_avx512vl(auVar87,auVar110);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar99,auVar88);
    auVar117 = vmulps_avx512vl(auVar88,auVar98);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar110,auVar86);
    auVar118 = vmulps_avx512vl(auVar86,auVar99);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar98,auVar87);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar114 = vfmadd231ps_avx512vl(auVar117,auVar114,auVar114);
    auVar113 = vmulps_avx512vl(auVar114,auVar113);
    auVar112 = vmaxps_avx512vl(auVar112,auVar113);
    auVar112 = vsqrtps_avx512vl(auVar112);
    auVar113 = vmaxps_avx512vl(auVar111,auVar97);
    auVar108 = vmaxps_avx512vl(auVar108,auVar113);
    auVar118 = vaddps_avx512vl(auVar112,auVar108);
    auVar108 = vminps_avx512vl(auVar111,auVar97);
    auVar108 = vminps_avx(auVar109,auVar108);
    auVar108 = vsubps_avx512vl(auVar108,auVar112);
    auVar113._8_4_ = 0x3f800002;
    auVar113._0_8_ = 0x3f8000023f800002;
    auVar113._12_4_ = 0x3f800002;
    auVar113._16_4_ = 0x3f800002;
    auVar113._20_4_ = 0x3f800002;
    auVar113._24_4_ = 0x3f800002;
    auVar113._28_4_ = 0x3f800002;
    auVar109 = vmulps_avx512vl(auVar118,auVar113);
    auVar114._8_4_ = 0x3f7ffffc;
    auVar114._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar114._12_4_ = 0x3f7ffffc;
    auVar114._16_4_ = 0x3f7ffffc;
    auVar114._20_4_ = 0x3f7ffffc;
    auVar114._24_4_ = 0x3f7ffffc;
    auVar114._28_4_ = 0x3f7ffffc;
    auVar108 = vmulps_avx512vl(auVar108,auVar114);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar97 = vrsqrt14ps_avx512vl(auVar115);
    auVar117._8_4_ = 0xbf000000;
    auVar117._0_8_ = 0xbf000000bf000000;
    auVar117._12_4_ = 0xbf000000;
    auVar117._16_4_ = 0xbf000000;
    auVar117._20_4_ = 0xbf000000;
    auVar117._24_4_ = 0xbf000000;
    auVar117._28_4_ = 0xbf000000;
    auVar111 = vmulps_avx512vl(auVar115,auVar117);
    fVar228 = auVar97._0_4_;
    fVar270 = auVar97._4_4_;
    fVar222 = auVar97._8_4_;
    fVar223 = auVar97._12_4_;
    fVar224 = auVar97._16_4_;
    fVar225 = auVar97._20_4_;
    fVar226 = auVar97._24_4_;
    auVar43._4_4_ = fVar270 * fVar270 * fVar270 * auVar111._4_4_;
    auVar43._0_4_ = fVar228 * fVar228 * fVar228 * auVar111._0_4_;
    auVar43._8_4_ = fVar222 * fVar222 * fVar222 * auVar111._8_4_;
    auVar43._12_4_ = fVar223 * fVar223 * fVar223 * auVar111._12_4_;
    auVar43._16_4_ = fVar224 * fVar224 * fVar224 * auVar111._16_4_;
    auVar43._20_4_ = fVar225 * fVar225 * fVar225 * auVar111._20_4_;
    auVar43._24_4_ = fVar226 * fVar226 * fVar226 * auVar111._24_4_;
    auVar43._28_4_ = auVar118._28_4_;
    auVar115._8_4_ = 0x3fc00000;
    auVar115._0_8_ = 0x3fc000003fc00000;
    auVar115._12_4_ = 0x3fc00000;
    auVar115._16_4_ = 0x3fc00000;
    auVar115._20_4_ = 0x3fc00000;
    auVar115._24_4_ = 0x3fc00000;
    auVar115._28_4_ = 0x3fc00000;
    auVar97 = vfmadd231ps_avx512vl(auVar43,auVar97,auVar115);
    auVar111 = vmulps_avx512vl(auVar86,auVar97);
    auVar112 = vmulps_avx512vl(auVar87,auVar97);
    auVar113 = vmulps_avx512vl(auVar88,auVar97);
    auVar114 = vsubps_avx512vl(auVar122,auVar92);
    auVar117 = vsubps_avx512vl(auVar122,auVar90);
    auVar115 = vsubps_avx512vl(auVar122,auVar91);
    auVar118 = vmulps_avx512vl(local_620,auVar115);
    auVar118 = vfmadd231ps_avx512vl(auVar118,local_600,auVar117);
    auVar118 = vfmadd231ps_avx512vl(auVar118,local_5e0,auVar114);
    auVar119 = vmulps_avx512vl(auVar115,auVar115);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar117,auVar117);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar114,auVar114);
    auVar120 = vmulps_avx512vl(local_620,auVar113);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar112,local_600);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar111,local_5e0);
    auVar113 = vmulps_avx512vl(auVar115,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar117,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar111);
    auVar112 = vmulps_avx512vl(auVar120,auVar120);
    auVar113 = vsubps_avx512vl(local_240,auVar112);
    auVar121 = vmulps_avx512vl(auVar120,auVar111);
    auVar118 = vsubps_avx512vl(auVar118,auVar121);
    auVar121 = vaddps_avx512vl(auVar118,auVar118);
    auVar118 = vmulps_avx512vl(auVar111,auVar111);
    local_740 = vsubps_avx512vl(auVar119,auVar118);
    auVar109 = vsubps_avx512vl(local_740,auVar109);
    auVar119 = vmulps_avx512vl(auVar121,auVar121);
    auVar118._8_4_ = 0x40800000;
    auVar118._0_8_ = 0x4080000040800000;
    auVar118._12_4_ = 0x40800000;
    auVar118._16_4_ = 0x40800000;
    auVar118._20_4_ = 0x40800000;
    auVar118._24_4_ = 0x40800000;
    auVar118._28_4_ = 0x40800000;
    _local_640 = vmulps_avx512vl(auVar113,auVar118);
    auVar118 = vmulps_avx512vl(_local_640,auVar109);
    auVar118 = vsubps_avx512vl(auVar119,auVar118);
    uVar72 = vcmpps_avx512vl(auVar118,auVar122,5);
    bVar60 = (byte)uVar72;
    if (bVar60 == 0) {
LAB_01ba0fee:
      auVar241 = ZEXT3264(_DAT_01f7b040);
      auVar108 = vmovdqa64_avx512vl(auVar103);
      auVar271 = ZEXT3264(auVar108);
      auVar108 = vmovdqa64_avx512vl(auVar105);
      auVar272 = ZEXT3264(auVar108);
    }
    else {
      auVar118 = vsqrtps_avx512vl(auVar118);
      auVar122 = vaddps_avx512vl(auVar113,auVar113);
      local_660 = vrcp14ps_avx512vl(auVar122);
      auVar116 = vfnmadd213ps_avx512vl(local_660,auVar122,auVar116);
      auVar116 = vfmadd132ps_avx512vl(auVar116,local_660,local_660);
      auVar30._8_4_ = 0x80000000;
      auVar30._0_8_ = 0x8000000080000000;
      auVar30._12_4_ = 0x80000000;
      auVar30._16_4_ = 0x80000000;
      auVar30._20_4_ = 0x80000000;
      auVar30._24_4_ = 0x80000000;
      auVar30._28_4_ = 0x80000000;
      local_680 = vxorps_avx512vl(auVar121,auVar30);
      auVar123 = vsubps_avx512vl(local_680,auVar118);
      auVar123 = vmulps_avx512vl(auVar123,auVar116);
      auVar118 = vsubps_avx512vl(auVar118,auVar121);
      local_6a0 = vmulps_avx512vl(auVar118,auVar116);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar116 = vblendmps_avx512vl(auVar118,auVar123);
      auVar124._0_4_ =
           (uint)(bVar60 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar118._0_4_;
      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar71 * auVar116._4_4_ | (uint)!bVar71 * auVar118._4_4_;
      bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar71 * auVar116._8_4_ | (uint)!bVar71 * auVar118._8_4_;
      bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar71 * auVar116._12_4_ | (uint)!bVar71 * auVar118._12_4_;
      bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar71 * auVar116._16_4_ | (uint)!bVar71 * auVar118._16_4_;
      bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar71 * auVar116._20_4_ | (uint)!bVar71 * auVar118._20_4_;
      bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar71 * auVar116._24_4_ | (uint)!bVar71 * auVar118._24_4_;
      bVar71 = SUB81(uVar72 >> 7,0);
      auVar124._28_4_ = (uint)bVar71 * auVar116._28_4_ | (uint)!bVar71 * auVar118._28_4_;
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar116 = vblendmps_avx512vl(auVar118,local_6a0);
      auVar125._0_4_ =
           (uint)(bVar60 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar118._0_4_;
      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar71 * auVar116._4_4_ | (uint)!bVar71 * auVar118._4_4_;
      bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar71 * auVar116._8_4_ | (uint)!bVar71 * auVar118._8_4_;
      bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar71 * auVar116._12_4_ | (uint)!bVar71 * auVar118._12_4_;
      bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar125._16_4_ = (uint)bVar71 * auVar116._16_4_ | (uint)!bVar71 * auVar118._16_4_;
      bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar125._20_4_ = (uint)bVar71 * auVar116._20_4_ | (uint)!bVar71 * auVar118._20_4_;
      bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar125._24_4_ = (uint)bVar71 * auVar116._24_4_ | (uint)!bVar71 * auVar118._24_4_;
      bVar71 = SUB81(uVar72 >> 7,0);
      auVar125._28_4_ = (uint)bVar71 * auVar116._28_4_ | (uint)!bVar71 * auVar118._28_4_;
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar112,auVar118);
      local_800 = vmaxps_avx512vl(local_260,auVar118);
      auVar31._8_4_ = 0x36000000;
      auVar31._0_8_ = 0x3600000036000000;
      auVar31._12_4_ = 0x36000000;
      auVar31._16_4_ = 0x36000000;
      auVar31._20_4_ = 0x36000000;
      auVar31._24_4_ = 0x36000000;
      auVar31._28_4_ = 0x36000000;
      local_820 = vmulps_avx512vl(local_800,auVar31);
      vandps_avx512vl(auVar113,auVar118);
      uVar67 = vcmpps_avx512vl(local_820,local_820,1);
      uVar72 = uVar72 & uVar67;
      bVar68 = (byte)uVar72;
      if (bVar68 != 0) {
        uVar67 = vcmpps_avx512vl(auVar109,_DAT_01f7b000,2);
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar113 = vblendmps_avx512vl(auVar109,auVar112);
        bVar65 = (byte)uVar67;
        uVar73 = (uint)(bVar65 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar65 & 1) * local_820._0_4_;
        bVar71 = (bool)((byte)(uVar67 >> 1) & 1);
        uVar142 = (uint)bVar71 * auVar113._4_4_ | (uint)!bVar71 * local_820._4_4_;
        bVar71 = (bool)((byte)(uVar67 >> 2) & 1);
        uVar143 = (uint)bVar71 * auVar113._8_4_ | (uint)!bVar71 * local_820._8_4_;
        bVar71 = (bool)((byte)(uVar67 >> 3) & 1);
        uVar144 = (uint)bVar71 * auVar113._12_4_ | (uint)!bVar71 * local_820._12_4_;
        bVar71 = (bool)((byte)(uVar67 >> 4) & 1);
        uVar145 = (uint)bVar71 * auVar113._16_4_ | (uint)!bVar71 * local_820._16_4_;
        bVar71 = (bool)((byte)(uVar67 >> 5) & 1);
        uVar146 = (uint)bVar71 * auVar113._20_4_ | (uint)!bVar71 * local_820._20_4_;
        bVar71 = (bool)((byte)(uVar67 >> 6) & 1);
        uVar147 = (uint)bVar71 * auVar113._24_4_ | (uint)!bVar71 * local_820._24_4_;
        bVar71 = SUB81(uVar67 >> 7,0);
        uVar148 = (uint)bVar71 * auVar113._28_4_ | (uint)!bVar71 * local_820._28_4_;
        auVar124._0_4_ = (bVar68 & 1) * uVar73 | !(bool)(bVar68 & 1) * auVar124._0_4_;
        bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar124._4_4_ = bVar71 * uVar142 | !bVar71 * auVar124._4_4_;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar124._8_4_ = bVar71 * uVar143 | !bVar71 * auVar124._8_4_;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar124._12_4_ = bVar71 * uVar144 | !bVar71 * auVar124._12_4_;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar124._16_4_ = bVar71 * uVar145 | !bVar71 * auVar124._16_4_;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar124._20_4_ = bVar71 * uVar146 | !bVar71 * auVar124._20_4_;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar124._24_4_ = bVar71 * uVar147 | !bVar71 * auVar124._24_4_;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar124._28_4_ = bVar71 * uVar148 | !bVar71 * auVar124._28_4_;
        auVar109 = vblendmps_avx512vl(auVar112,auVar109);
        bVar71 = (bool)((byte)(uVar67 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar67 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar67 >> 6) & 1);
        bVar16 = SUB81(uVar67 >> 7,0);
        auVar125._0_4_ =
             (uint)(bVar68 & 1) *
             ((uint)(bVar65 & 1) * auVar109._0_4_ | !(bool)(bVar65 & 1) * uVar73) |
             !(bool)(bVar68 & 1) * auVar125._0_4_;
        bVar10 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar125._4_4_ =
             (uint)bVar10 * ((uint)bVar71 * auVar109._4_4_ | !bVar71 * uVar142) |
             !bVar10 * auVar125._4_4_;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar125._8_4_ =
             (uint)bVar71 * ((uint)bVar11 * auVar109._8_4_ | !bVar11 * uVar143) |
             !bVar71 * auVar125._8_4_;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar125._12_4_ =
             (uint)bVar71 * ((uint)bVar12 * auVar109._12_4_ | !bVar12 * uVar144) |
             !bVar71 * auVar125._12_4_;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar125._16_4_ =
             (uint)bVar71 * ((uint)bVar13 * auVar109._16_4_ | !bVar13 * uVar145) |
             !bVar71 * auVar125._16_4_;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar125._20_4_ =
             (uint)bVar71 * ((uint)bVar14 * auVar109._20_4_ | !bVar14 * uVar146) |
             !bVar71 * auVar125._20_4_;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar125._24_4_ =
             (uint)bVar71 * ((uint)bVar15 * auVar109._24_4_ | !bVar15 * uVar147) |
             !bVar71 * auVar125._24_4_;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar125._28_4_ =
             (uint)bVar71 * ((uint)bVar16 * auVar109._28_4_ | !bVar16 * uVar148) |
             !bVar71 * auVar125._28_4_;
        bVar60 = (~bVar68 | bVar65) & bVar60;
      }
      if ((bVar60 & 0x7f) == 0) {
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar273 = ZEXT3264(auVar108);
        goto LAB_01ba0fee;
      }
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar110 = vxorps_avx512vl(auVar110,auVar109);
      auVar98 = vxorps_avx512vl(auVar98,auVar109);
      auVar241 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
      auVar99 = vxorps_avx512vl(auVar99,auVar109);
      auVar77 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                               ZEXT416((uint)local_6f0._0_4_));
      auVar112 = vbroadcastss_avx512vl(auVar77);
      auVar112 = vminps_avx512vl(auVar112,auVar125);
      auVar59._4_4_ = fStack_31c;
      auVar59._0_4_ = local_320;
      auVar59._8_4_ = fStack_318;
      auVar59._12_4_ = fStack_314;
      auVar59._16_4_ = fStack_310;
      auVar59._20_4_ = fStack_30c;
      auVar59._24_4_ = fStack_308;
      auVar59._28_4_ = fStack_304;
      auVar113 = vmaxps_avx512vl(auVar59,auVar124);
      auVar115 = vmulps_avx512vl(auVar115,auVar41);
      auVar117 = vfmadd213ps_avx512vl(auVar117,auVar40,auVar115);
      auVar77 = vfmadd213ps_fma(auVar114,auVar39,auVar117);
      auVar114 = vmulps_avx512vl(local_620,auVar41);
      auVar114 = vfmadd231ps_avx512vl(auVar114,local_600,auVar40);
      auVar114 = vfmadd231ps_avx512vl(auVar114,local_5e0,auVar39);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar114,auVar117);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar18 = vcmpps_avx512vl(auVar117,auVar115,1);
      auVar118 = vxorps_avx512vl(ZEXT1632(auVar77),auVar109);
      auVar116 = vrcp14ps_avx512vl(auVar114);
      auVar126 = vxorps_avx512vl(auVar114,auVar109);
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar128 = vfnmadd213ps_avx512vl(auVar116,auVar114,auVar127);
      auVar77 = vfmadd132ps_fma(auVar128,auVar116,auVar116);
      fVar228 = auVar77._0_4_ * auVar118._0_4_;
      fVar270 = auVar77._4_4_ * auVar118._4_4_;
      auVar44._4_4_ = fVar270;
      auVar44._0_4_ = fVar228;
      fVar222 = auVar77._8_4_ * auVar118._8_4_;
      auVar44._8_4_ = fVar222;
      fVar223 = auVar77._12_4_ * auVar118._12_4_;
      auVar44._12_4_ = fVar223;
      fVar224 = auVar118._16_4_ * 0.0;
      auVar44._16_4_ = fVar224;
      fVar225 = auVar118._20_4_ * 0.0;
      auVar44._20_4_ = fVar225;
      fVar226 = auVar118._24_4_ * 0.0;
      auVar44._24_4_ = fVar226;
      auVar44._28_4_ = auVar118._28_4_;
      uVar20 = vcmpps_avx512vl(auVar114,auVar126,1);
      bVar68 = (byte)uVar18 | (byte)uVar20;
      auVar266._8_4_ = 0xff800000;
      auVar266._0_8_ = 0xff800000ff800000;
      auVar266._12_4_ = 0xff800000;
      auVar266._16_4_ = 0xff800000;
      auVar266._20_4_ = 0xff800000;
      auVar266._24_4_ = 0xff800000;
      auVar266._28_4_ = 0xff800000;
      auVar116 = vblendmps_avx512vl(auVar44,auVar266);
      auVar129._0_4_ = (uint)(bVar68 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar68 & 1) * -0x800000;
      bVar71 = (bool)(bVar68 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar71 * auVar116._4_4_ | (uint)!bVar71 * -0x800000;
      bVar71 = (bool)(bVar68 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar71 * auVar116._8_4_ | (uint)!bVar71 * -0x800000;
      bVar71 = (bool)(bVar68 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar71 * auVar116._12_4_ | (uint)!bVar71 * -0x800000;
      bVar71 = (bool)(bVar68 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar71 * auVar116._16_4_ | (uint)!bVar71 * -0x800000;
      bVar71 = (bool)(bVar68 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar71 * auVar116._20_4_ | (uint)!bVar71 * -0x800000;
      bVar71 = (bool)(bVar68 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar71 * auVar116._24_4_ | (uint)!bVar71 * -0x800000;
      auVar129._28_4_ =
           (uint)(bVar68 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar68 >> 7) * -0x800000;
      auVar116 = vmaxps_avx512vl(auVar113,auVar129);
      uVar20 = vcmpps_avx512vl(auVar114,auVar126,6);
      bVar68 = (byte)uVar18 | (byte)uVar20;
      auVar130._0_4_ = (uint)(bVar68 & 1) * 0x7f800000 | (uint)!(bool)(bVar68 & 1) * (int)fVar228;
      bVar71 = (bool)(bVar68 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar270;
      bVar71 = (bool)(bVar68 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar222;
      bVar71 = (bool)(bVar68 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar223;
      bVar71 = (bool)(bVar68 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar224;
      bVar71 = (bool)(bVar68 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar225;
      bVar71 = (bool)(bVar68 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar226;
      auVar130._28_4_ =
           (uint)(bVar68 >> 7) * 0x7f800000 | (uint)!(bool)(bVar68 >> 7) * auVar118._28_4_;
      auVar112 = vminps_avx512vl(auVar112,auVar130);
      auVar77 = vxorps_avx512vl(auVar113._0_16_,auVar113._0_16_);
      auVar89 = vsubps_avx512vl(ZEXT1632(auVar77),auVar89);
      auVar93 = vsubps_avx512vl(ZEXT1632(auVar77),auVar93);
      auVar113 = ZEXT1632(auVar77);
      auVar94 = vsubps_avx512vl(auVar113,auVar94);
      auVar94 = vmulps_avx512vl(auVar94,auVar110);
      auVar93 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar93);
      auVar89 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar89);
      auVar93 = vmulps_avx512vl(local_620,auVar110);
      auVar93 = vfmadd231ps_avx512vl(auVar93,local_600,auVar99);
      auVar93 = vfmadd231ps_avx512vl(auVar93,local_5e0,auVar98);
      vandps_avx512vl(auVar93,auVar117);
      auVar273 = ZEXT3264(auVar127);
      uVar18 = vcmpps_avx512vl(auVar93,auVar115,1);
      auVar89 = vxorps_avx512vl(auVar89,auVar109);
      auVar94 = vrcp14ps_avx512vl(auVar93);
      auVar98 = vxorps_avx512vl(auVar93,auVar109);
      auVar263 = ZEXT3264(auVar98);
      auVar109 = vfnmadd213ps_avx512vl(auVar94,auVar93,auVar127);
      auVar77 = vfmadd132ps_fma(auVar109,auVar94,auVar94);
      fVar228 = auVar77._0_4_ * auVar89._0_4_;
      fVar270 = auVar77._4_4_ * auVar89._4_4_;
      auVar45._4_4_ = fVar270;
      auVar45._0_4_ = fVar228;
      fVar222 = auVar77._8_4_ * auVar89._8_4_;
      auVar45._8_4_ = fVar222;
      fVar223 = auVar77._12_4_ * auVar89._12_4_;
      auVar45._12_4_ = fVar223;
      fVar224 = auVar89._16_4_ * 0.0;
      auVar45._16_4_ = fVar224;
      fVar225 = auVar89._20_4_ * 0.0;
      auVar45._20_4_ = fVar225;
      fVar226 = auVar89._24_4_ * 0.0;
      auVar45._24_4_ = fVar226;
      auVar45._28_4_ = auVar89._28_4_;
      uVar20 = vcmpps_avx512vl(auVar93,auVar98,1);
      bVar68 = (byte)uVar18 | (byte)uVar20;
      auVar32._8_4_ = 0xff800000;
      auVar32._0_8_ = 0xff800000ff800000;
      auVar32._12_4_ = 0xff800000;
      auVar32._16_4_ = 0xff800000;
      auVar32._20_4_ = 0xff800000;
      auVar32._24_4_ = 0xff800000;
      auVar32._28_4_ = 0xff800000;
      auVar109 = vblendmps_avx512vl(auVar45,auVar32);
      auVar131._0_4_ =
           (uint)(bVar68 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar94._0_4_;
      bVar71 = (bool)(bVar68 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar71 * auVar109._4_4_ | (uint)!bVar71 * auVar94._4_4_;
      bVar71 = (bool)(bVar68 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar71 * auVar109._8_4_ | (uint)!bVar71 * auVar94._8_4_;
      bVar71 = (bool)(bVar68 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar71 * auVar109._12_4_ | (uint)!bVar71 * auVar94._12_4_;
      bVar71 = (bool)(bVar68 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar71 * auVar109._16_4_ | (uint)!bVar71 * auVar94._16_4_;
      bVar71 = (bool)(bVar68 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar71 * auVar109._20_4_ | (uint)!bVar71 * auVar94._20_4_;
      bVar71 = (bool)(bVar68 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar71 * auVar109._24_4_ | (uint)!bVar71 * auVar94._24_4_;
      auVar131._28_4_ =
           (uint)(bVar68 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar94._28_4_;
      auVar109 = vmaxps_avx(auVar116,auVar131);
      auVar262 = ZEXT3264(auVar109);
      uVar20 = vcmpps_avx512vl(auVar93,auVar98,6);
      bVar68 = (byte)uVar18 | (byte)uVar20;
      auVar132._0_4_ = (uint)(bVar68 & 1) * 0x7f800000 | (uint)!(bool)(bVar68 & 1) * (int)fVar228;
      bVar71 = (bool)(bVar68 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar270;
      bVar71 = (bool)(bVar68 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar222;
      bVar71 = (bool)(bVar68 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar223;
      bVar71 = (bool)(bVar68 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar224;
      bVar71 = (bool)(bVar68 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar225;
      bVar71 = (bool)(bVar68 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar226;
      auVar132._28_4_ =
           (uint)(bVar68 >> 7) * 0x7f800000 | (uint)!(bool)(bVar68 >> 7) * auVar89._28_4_;
      local_380 = vminps_avx(auVar112,auVar132);
      uVar18 = vcmpps_avx512vl(auVar109,local_380,2);
      bVar60 = bVar60 & 0x7f & (byte)uVar18;
      if (bVar60 == 0) goto LAB_01ba0fee;
      auVar89 = vmaxps_avx512vl(auVar113,auVar108);
      auVar108 = vfmadd213ps_avx512vl(auVar123,auVar120,auVar111);
      fVar228 = auVar97._0_4_;
      fVar270 = auVar97._4_4_;
      auVar46._4_4_ = fVar270 * auVar108._4_4_;
      auVar46._0_4_ = fVar228 * auVar108._0_4_;
      fVar222 = auVar97._8_4_;
      auVar46._8_4_ = fVar222 * auVar108._8_4_;
      fVar223 = auVar97._12_4_;
      auVar46._12_4_ = fVar223 * auVar108._12_4_;
      fVar224 = auVar97._16_4_;
      auVar46._16_4_ = fVar224 * auVar108._16_4_;
      fVar225 = auVar97._20_4_;
      auVar46._20_4_ = fVar225 * auVar108._20_4_;
      fVar226 = auVar97._24_4_;
      auVar46._24_4_ = fVar226 * auVar108._24_4_;
      auVar46._28_4_ = auVar108._28_4_;
      auVar108 = vfmadd213ps_avx512vl(local_6a0,auVar120,auVar111);
      auVar47._4_4_ = fVar270 * auVar108._4_4_;
      auVar47._0_4_ = fVar228 * auVar108._0_4_;
      auVar47._8_4_ = fVar222 * auVar108._8_4_;
      auVar47._12_4_ = fVar223 * auVar108._12_4_;
      auVar47._16_4_ = fVar224 * auVar108._16_4_;
      auVar47._20_4_ = fVar225 * auVar108._20_4_;
      auVar47._24_4_ = fVar226 * auVar108._24_4_;
      auVar47._28_4_ = auVar108._28_4_;
      auVar108 = vminps_avx512vl(auVar46,auVar127);
      auVar54 = ZEXT812(0);
      auVar93 = ZEXT1232(auVar54) << 0x20;
      auVar108 = vmaxps_avx(auVar108,ZEXT1232(auVar54) << 0x20);
      auVar94 = vminps_avx512vl(auVar47,auVar127);
      auVar48._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
      auVar48._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
      auVar48._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
      auVar48._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
      auVar48._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
      auVar48._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
      auVar48._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
      auVar48._28_4_ = auVar108._28_4_ + 7.0;
      local_1e0 = vfmadd213ps_avx512vl(auVar48,auVar158,auVar232);
      auVar108 = vmaxps_avx(auVar94,ZEXT1232(auVar54) << 0x20);
      auVar49._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
      auVar49._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
      auVar49._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
      auVar49._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
      auVar49._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
      auVar49._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
      auVar49._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
      auVar49._28_4_ = auVar108._28_4_ + 7.0;
      local_200 = vfmadd213ps_avx512vl(auVar49,auVar158,auVar232);
      auVar50._4_4_ = auVar89._4_4_ * auVar89._4_4_;
      auVar50._0_4_ = auVar89._0_4_ * auVar89._0_4_;
      auVar50._8_4_ = auVar89._8_4_ * auVar89._8_4_;
      auVar50._12_4_ = auVar89._12_4_ * auVar89._12_4_;
      auVar50._16_4_ = auVar89._16_4_ * auVar89._16_4_;
      auVar50._20_4_ = auVar89._20_4_ * auVar89._20_4_;
      auVar50._24_4_ = auVar89._24_4_ * auVar89._24_4_;
      auVar50._28_4_ = auVar89._28_4_;
      auVar108 = vsubps_avx(local_740,auVar50);
      auVar51._4_4_ = auVar108._4_4_ * (float)local_640._4_4_;
      auVar51._0_4_ = auVar108._0_4_ * (float)local_640._0_4_;
      auVar51._8_4_ = auVar108._8_4_ * fStack_638;
      auVar51._12_4_ = auVar108._12_4_ * fStack_634;
      auVar51._16_4_ = auVar108._16_4_ * fStack_630;
      auVar51._20_4_ = auVar108._20_4_ * fStack_62c;
      auVar51._24_4_ = auVar108._24_4_ * fStack_628;
      auVar51._28_4_ = auVar89._28_4_;
      auVar89 = vsubps_avx(auVar119,auVar51);
      uVar18 = vcmpps_avx512vl(auVar89,ZEXT1232(auVar54) << 0x20,5);
      bVar68 = (byte)uVar18;
      if (bVar68 == 0) {
        bVar68 = 0;
        auVar86 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar253 = ZEXT864(0) << 0x20;
        auVar89 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar94 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar262 = ZEXT864(0) << 0x20;
        auVar133._8_4_ = 0x7f800000;
        auVar133._0_8_ = 0x7f8000007f800000;
        auVar133._12_4_ = 0x7f800000;
        auVar133._16_4_ = 0x7f800000;
        auVar133._20_4_ = 0x7f800000;
        auVar133._24_4_ = 0x7f800000;
        auVar133._28_4_ = 0x7f800000;
        auVar134._8_4_ = 0xff800000;
        auVar134._0_8_ = 0xff800000ff800000;
        auVar134._12_4_ = 0xff800000;
        auVar134._16_4_ = 0xff800000;
        auVar134._20_4_ = 0xff800000;
        auVar134._24_4_ = 0xff800000;
        auVar134._28_4_ = 0xff800000;
      }
      else {
        auVar78 = vxorps_avx512vl(auVar149,auVar149);
        uVar72 = vcmpps_avx512vl(auVar89,auVar113,5);
        auVar89 = vsqrtps_avx(auVar89);
        auVar93 = vfnmadd213ps_avx512vl(auVar122,local_660,auVar127);
        auVar98 = vfmadd132ps_avx512vl(auVar93,local_660,local_660);
        auVar93 = vsubps_avx(local_680,auVar89);
        auVar99 = vmulps_avx512vl(auVar93,auVar98);
        auVar89 = vsubps_avx512vl(auVar89,auVar121);
        auVar98 = vmulps_avx512vl(auVar89,auVar98);
        auVar89 = vfmadd213ps_avx512vl(auVar120,auVar99,auVar111);
        auVar52._4_4_ = fVar270 * auVar89._4_4_;
        auVar52._0_4_ = fVar228 * auVar89._0_4_;
        auVar52._8_4_ = fVar222 * auVar89._8_4_;
        auVar52._12_4_ = fVar223 * auVar89._12_4_;
        auVar52._16_4_ = fVar224 * auVar89._16_4_;
        auVar52._20_4_ = fVar225 * auVar89._20_4_;
        auVar52._24_4_ = fVar226 * auVar89._24_4_;
        auVar52._28_4_ = auVar94._28_4_;
        auVar89 = vmulps_avx512vl(local_5e0,auVar99);
        auVar93 = vmulps_avx512vl(local_600,auVar99);
        auVar110 = vmulps_avx512vl(local_620,auVar99);
        auVar94 = vfmadd213ps_avx512vl(auVar86,auVar52,auVar92);
        auVar89 = vsubps_avx512vl(auVar89,auVar94);
        auVar94 = vfmadd213ps_avx512vl(auVar87,auVar52,auVar90);
        auVar94 = vsubps_avx512vl(auVar93,auVar94);
        auVar77 = vfmadd213ps_fma(auVar52,auVar88,auVar91);
        auVar93 = vsubps_avx(auVar110,ZEXT1632(auVar77));
        auVar262 = ZEXT3264(auVar93);
        auVar93 = vfmadd213ps_avx512vl(auVar120,auVar98,auVar111);
        auVar97 = vmulps_avx512vl(auVar97,auVar93);
        auVar93 = vmulps_avx512vl(local_5e0,auVar98);
        auVar110 = vmulps_avx512vl(local_600,auVar98);
        auVar111 = vmulps_avx512vl(local_620,auVar98);
        auVar77 = vfmadd213ps_fma(auVar86,auVar97,auVar92);
        auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar77));
        auVar77 = vfmadd213ps_fma(auVar87,auVar97,auVar90);
        auVar86 = vsubps_avx512vl(auVar110,ZEXT1632(auVar77));
        auVar77 = vfmadd213ps_fma(auVar88,auVar97,auVar91);
        auVar87 = vsubps_avx512vl(auVar111,ZEXT1632(auVar77));
        auVar253 = ZEXT3264(auVar87);
        auVar159._8_4_ = 0x7f800000;
        auVar159._0_8_ = 0x7f8000007f800000;
        auVar159._12_4_ = 0x7f800000;
        auVar159._16_4_ = 0x7f800000;
        auVar159._20_4_ = 0x7f800000;
        auVar159._24_4_ = 0x7f800000;
        auVar159._28_4_ = 0x7f800000;
        auVar87 = vblendmps_avx512vl(auVar159,auVar99);
        bVar71 = (bool)((byte)uVar72 & 1);
        auVar133._0_4_ = (uint)bVar71 * auVar87._0_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar71 * auVar87._4_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar71 * auVar87._8_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar71 * auVar87._12_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar71 * auVar87._16_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar71 * auVar87._20_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar71 * auVar87._24_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar133._28_4_ = (uint)bVar71 * auVar87._28_4_ | (uint)!bVar71 * 0x7f800000;
        auVar202._8_4_ = 0xff800000;
        auVar202._0_8_ = 0xff800000ff800000;
        auVar202._12_4_ = 0xff800000;
        auVar202._16_4_ = 0xff800000;
        auVar202._20_4_ = 0xff800000;
        auVar202._24_4_ = 0xff800000;
        auVar202._28_4_ = 0xff800000;
        auVar87 = vblendmps_avx512vl(auVar202,auVar98);
        bVar71 = (bool)((byte)uVar72 & 1);
        auVar134._0_4_ = (uint)bVar71 * auVar87._0_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar71 * auVar87._4_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar71 * auVar87._8_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar71 * auVar87._12_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar134._16_4_ = (uint)bVar71 * auVar87._16_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar134._20_4_ = (uint)bVar71 * auVar87._20_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar134._24_4_ = (uint)bVar71 * auVar87._24_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar134._28_4_ = (uint)bVar71 * auVar87._28_4_ | (uint)!bVar71 * -0x800000;
        auVar33._8_4_ = 0x36000000;
        auVar33._0_8_ = 0x3600000036000000;
        auVar33._12_4_ = 0x36000000;
        auVar33._16_4_ = 0x36000000;
        auVar33._20_4_ = 0x36000000;
        auVar33._24_4_ = 0x36000000;
        auVar33._28_4_ = 0x36000000;
        auVar87 = vmulps_avx512vl(local_800,auVar33);
        uVar67 = vcmpps_avx512vl(auVar87,local_820,0xe);
        uVar72 = uVar72 & uVar67;
        bVar65 = (byte)uVar72;
        if (bVar65 != 0) {
          uVar67 = vcmpps_avx512vl(auVar108,ZEXT1632(auVar78),2);
          auVar257._8_4_ = 0x7f800000;
          auVar257._0_8_ = 0x7f8000007f800000;
          auVar257._12_4_ = 0x7f800000;
          auVar257._16_4_ = 0x7f800000;
          auVar257._20_4_ = 0x7f800000;
          auVar257._24_4_ = 0x7f800000;
          auVar257._28_4_ = 0x7f800000;
          auVar267._8_4_ = 0xff800000;
          auVar267._0_8_ = 0xff800000ff800000;
          auVar267._12_4_ = 0xff800000;
          auVar267._16_4_ = 0xff800000;
          auVar267._20_4_ = 0xff800000;
          auVar267._24_4_ = 0xff800000;
          auVar267._28_4_ = 0xff800000;
          auVar108 = vblendmps_avx512vl(auVar257,auVar267);
          bVar61 = (byte)uVar67;
          uVar73 = (uint)(bVar61 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar87._0_4_;
          bVar71 = (bool)((byte)(uVar67 >> 1) & 1);
          uVar142 = (uint)bVar71 * auVar108._4_4_ | (uint)!bVar71 * auVar87._4_4_;
          bVar71 = (bool)((byte)(uVar67 >> 2) & 1);
          uVar143 = (uint)bVar71 * auVar108._8_4_ | (uint)!bVar71 * auVar87._8_4_;
          bVar71 = (bool)((byte)(uVar67 >> 3) & 1);
          uVar144 = (uint)bVar71 * auVar108._12_4_ | (uint)!bVar71 * auVar87._12_4_;
          bVar71 = (bool)((byte)(uVar67 >> 4) & 1);
          uVar145 = (uint)bVar71 * auVar108._16_4_ | (uint)!bVar71 * auVar87._16_4_;
          bVar71 = (bool)((byte)(uVar67 >> 5) & 1);
          uVar146 = (uint)bVar71 * auVar108._20_4_ | (uint)!bVar71 * auVar87._20_4_;
          bVar71 = (bool)((byte)(uVar67 >> 6) & 1);
          uVar147 = (uint)bVar71 * auVar108._24_4_ | (uint)!bVar71 * auVar87._24_4_;
          bVar71 = SUB81(uVar67 >> 7,0);
          uVar148 = (uint)bVar71 * auVar108._28_4_ | (uint)!bVar71 * auVar87._28_4_;
          auVar133._0_4_ = (bVar65 & 1) * uVar73 | !(bool)(bVar65 & 1) * auVar133._0_4_;
          bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar133._4_4_ = bVar71 * uVar142 | !bVar71 * auVar133._4_4_;
          bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar133._8_4_ = bVar71 * uVar143 | !bVar71 * auVar133._8_4_;
          bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar133._12_4_ = bVar71 * uVar144 | !bVar71 * auVar133._12_4_;
          bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar133._16_4_ = bVar71 * uVar145 | !bVar71 * auVar133._16_4_;
          bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar133._20_4_ = bVar71 * uVar146 | !bVar71 * auVar133._20_4_;
          bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar133._24_4_ = bVar71 * uVar147 | !bVar71 * auVar133._24_4_;
          bVar71 = SUB81(uVar72 >> 7,0);
          auVar133._28_4_ = bVar71 * uVar148 | !bVar71 * auVar133._28_4_;
          auVar108 = vblendmps_avx512vl(auVar267,auVar257);
          bVar71 = (bool)((byte)(uVar67 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar67 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar67 >> 6) & 1);
          bVar16 = SUB81(uVar67 >> 7,0);
          auVar134._0_4_ =
               (uint)(bVar65 & 1) *
               ((uint)(bVar61 & 1) * auVar108._0_4_ | !(bool)(bVar61 & 1) * uVar73) |
               !(bool)(bVar65 & 1) * auVar134._0_4_;
          bVar10 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar134._4_4_ =
               (uint)bVar10 * ((uint)bVar71 * auVar108._4_4_ | !bVar71 * uVar142) |
               !bVar10 * auVar134._4_4_;
          bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar134._8_4_ =
               (uint)bVar71 * ((uint)bVar11 * auVar108._8_4_ | !bVar11 * uVar143) |
               !bVar71 * auVar134._8_4_;
          bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar134._12_4_ =
               (uint)bVar71 * ((uint)bVar12 * auVar108._12_4_ | !bVar12 * uVar144) |
               !bVar71 * auVar134._12_4_;
          bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar134._16_4_ =
               (uint)bVar71 * ((uint)bVar13 * auVar108._16_4_ | !bVar13 * uVar145) |
               !bVar71 * auVar134._16_4_;
          bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar134._20_4_ =
               (uint)bVar71 * ((uint)bVar14 * auVar108._20_4_ | !bVar14 * uVar146) |
               !bVar71 * auVar134._20_4_;
          bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar134._24_4_ =
               (uint)bVar71 * ((uint)bVar15 * auVar108._24_4_ | !bVar15 * uVar147) |
               !bVar71 * auVar134._24_4_;
          bVar71 = SUB81(uVar72 >> 7,0);
          auVar134._28_4_ =
               (uint)bVar71 * ((uint)bVar16 * auVar108._28_4_ | !bVar16 * uVar148) |
               !bVar71 * auVar134._28_4_;
          bVar68 = (~bVar65 | bVar61) & bVar68;
        }
      }
      auVar108 = vmovdqa64_avx512vl(auVar103);
      auVar271 = ZEXT3264(auVar108);
      auVar108 = vmovdqa64_avx512vl(auVar105);
      auVar272 = ZEXT3264(auVar108);
      auVar258._0_4_ = local_620._0_4_ * auVar253._0_4_;
      auVar258._4_4_ = local_620._4_4_ * auVar253._4_4_;
      auVar258._8_4_ = local_620._8_4_ * auVar253._8_4_;
      auVar258._12_4_ = local_620._12_4_ * auVar253._12_4_;
      auVar258._16_4_ = local_620._16_4_ * auVar253._16_4_;
      auVar258._20_4_ = local_620._20_4_ * auVar253._20_4_;
      auVar258._28_36_ = auVar253._28_36_;
      auVar258._24_4_ = local_620._24_4_ * auVar253._24_4_;
      auVar77 = vfmadd231ps_fma(auVar258._0_32_,local_600,auVar86);
      auVar258 = ZEXT3264(local_5e0);
      auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),local_5e0,auVar93);
      auVar252._8_4_ = 0x7fffffff;
      auVar252._0_8_ = 0x7fffffff7fffffff;
      auVar252._12_4_ = 0x7fffffff;
      auVar252._16_4_ = 0x7fffffff;
      auVar252._20_4_ = 0x7fffffff;
      auVar252._24_4_ = 0x7fffffff;
      auVar252._28_4_ = 0x7fffffff;
      auVar253 = ZEXT3264(auVar252);
      auVar108 = vandps_avx(ZEXT1632(auVar77),auVar252);
      auVar263 = ZEXT3264(auVar109);
      _local_1c0 = auVar109;
      auVar243._8_4_ = 0x3e99999a;
      auVar243._0_8_ = 0x3e99999a3e99999a;
      auVar243._12_4_ = 0x3e99999a;
      auVar243._16_4_ = 0x3e99999a;
      auVar243._20_4_ = 0x3e99999a;
      auVar243._24_4_ = 0x3e99999a;
      auVar243._28_4_ = 0x3e99999a;
      uVar18 = vcmpps_avx512vl(auVar108,auVar243,1);
      _local_5a0 = vmaxps_avx(auVar109,auVar134);
      _local_3a0 = _local_5a0;
      auVar108 = vminps_avx(local_380,auVar133);
      uVar20 = vcmpps_avx512vl(auVar109,auVar108,2);
      bVar65 = (byte)uVar20 & bVar60;
      uVar19 = vcmpps_avx512vl(_local_5a0,local_380,2);
      if ((bVar60 & ((byte)uVar19 | (byte)uVar20)) != 0) {
        bVar61 = (byte)uVar18 | ~bVar68;
        auVar53._4_4_ = local_620._4_4_ * auVar262._4_4_;
        auVar53._0_4_ = local_620._0_4_ * auVar262._0_4_;
        auVar53._8_4_ = local_620._8_4_ * auVar262._8_4_;
        auVar53._12_4_ = local_620._12_4_ * auVar262._12_4_;
        auVar53._16_4_ = local_620._16_4_ * auVar262._16_4_;
        auVar53._20_4_ = local_620._20_4_ * auVar262._20_4_;
        auVar53._24_4_ = local_620._24_4_ * auVar262._24_4_;
        auVar53._28_4_ = auVar108._28_4_;
        auVar77 = vfmadd213ps_fma(auVar94,local_600,auVar53);
        auVar77 = vfmadd213ps_fma(auVar89,local_5e0,ZEXT1632(auVar77));
        auVar108 = vandps_avx(ZEXT1632(auVar77),auVar252);
        uVar18 = vcmpps_avx512vl(auVar108,auVar243,1);
        bVar68 = (byte)uVar18 | ~bVar68;
        auVar160._8_4_ = 2;
        auVar160._0_8_ = 0x200000002;
        auVar160._12_4_ = 2;
        auVar160._16_4_ = 2;
        auVar160._20_4_ = 2;
        auVar160._24_4_ = 2;
        auVar160._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar108 = vpblendmd_avx512vl(auVar160,auVar34);
        local_360._0_4_ = (uint)(bVar68 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar68 & 1) * 2;
        bVar71 = (bool)(bVar68 >> 1 & 1);
        local_360._4_4_ = (uint)bVar71 * auVar108._4_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 2 & 1);
        local_360._8_4_ = (uint)bVar71 * auVar108._8_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 3 & 1);
        local_360._12_4_ = (uint)bVar71 * auVar108._12_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 4 & 1);
        local_360._16_4_ = (uint)bVar71 * auVar108._16_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 5 & 1);
        local_360._20_4_ = (uint)bVar71 * auVar108._20_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 6 & 1);
        local_360._24_4_ = (uint)bVar71 * auVar108._24_4_ | (uint)!bVar71 * 2;
        local_360._28_4_ = (uint)(bVar68 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar68 >> 7) * 2;
        local_520 = vpbroadcastd_avx512vl();
        uVar18 = vpcmpd_avx512vl(local_520,local_360,5);
        local_580 = auVar109._0_4_ + (float)local_5c0._0_4_;
        fStack_57c = auVar109._4_4_ + (float)local_5c0._4_4_;
        fStack_578 = auVar109._8_4_ + fStack_5b8;
        fStack_574 = auVar109._12_4_ + fStack_5b4;
        fStack_570 = auVar109._16_4_ + fStack_5b0;
        fStack_56c = auVar109._20_4_ + fStack_5ac;
        fStack_568 = auVar109._24_4_ + fStack_5a8;
        fStack_564 = auVar109._28_4_ + fStack_5a4;
        for (bVar68 = (byte)uVar18 & bVar65; auVar108 = _local_3a0,
            auVar137._16_16_ = auVar107._16_16_, bVar68 != 0;
            bVar68 = ~bVar66 & bVar68 & (byte)uVar18) {
          auVar161._8_4_ = 0x7f800000;
          auVar161._0_8_ = 0x7f8000007f800000;
          auVar161._12_4_ = 0x7f800000;
          auVar161._16_4_ = 0x7f800000;
          auVar161._20_4_ = 0x7f800000;
          auVar161._24_4_ = 0x7f800000;
          auVar161._28_4_ = 0x7f800000;
          auVar108 = vblendmps_avx512vl(auVar161,auVar109);
          auVar135._0_4_ =
               (uint)(bVar68 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 1 & 1);
          auVar135._4_4_ = (uint)bVar71 * auVar108._4_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 2 & 1);
          auVar135._8_4_ = (uint)bVar71 * auVar108._8_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 3 & 1);
          auVar135._12_4_ = (uint)bVar71 * auVar108._12_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 4 & 1);
          auVar135._16_4_ = (uint)bVar71 * auVar108._16_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 5 & 1);
          auVar135._20_4_ = (uint)bVar71 * auVar108._20_4_ | (uint)!bVar71 * 0x7f800000;
          auVar135._24_4_ =
               (uint)(bVar68 >> 6) * auVar108._24_4_ | (uint)!(bool)(bVar68 >> 6) * 0x7f800000;
          auVar135._28_4_ = 0x7f800000;
          auVar108 = vshufps_avx(auVar135,auVar135,0xb1);
          auVar108 = vminps_avx(auVar135,auVar108);
          auVar86 = vshufpd_avx(auVar108,auVar108,5);
          auVar108 = vminps_avx(auVar108,auVar86);
          auVar86 = vpermpd_avx2(auVar108,0x4e);
          auVar108 = vminps_avx(auVar108,auVar86);
          uVar18 = vcmpps_avx512vl(auVar135,auVar108,0);
          bVar62 = (byte)uVar18 & bVar68;
          bVar66 = bVar68;
          if (bVar62 != 0) {
            bVar66 = bVar62;
          }
          iVar21 = 0;
          for (uVar73 = (uint)bVar66; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
            iVar21 = iVar21 + 1;
          }
          bVar66 = '\x01' << ((byte)iVar21 & 0x1f);
          uVar73 = *(uint *)(local_1e0 + (uint)(iVar21 << 2));
          uVar142 = *(uint *)(local_1c0 + (uint)(iVar21 << 2));
          fVar228 = auVar74._0_4_;
          if ((float)local_7e0._0_4_ < 0.0) {
            auVar258 = ZEXT1664(auVar258._0_16_);
            auVar262 = ZEXT1664(auVar262._0_16_);
            auVar263 = ZEXT1664(auVar263._0_16_);
            fVar228 = sqrtf((float)local_7e0._0_4_);
            auVar108 = vmovdqa64_avx512vl(auVar105);
            auVar272 = ZEXT3264(auVar108);
            auVar108 = vmovdqa64_avx512vl(auVar103);
            auVar271 = ZEXT3264(auVar108);
          }
          auVar253 = ZEXT464(uVar142);
          uVar72 = (ulong)bVar66;
          auVar78 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar77 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar85 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar3 = vminps_avx(auVar78,auVar85);
          auVar78 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar85 = vmaxps_avx(auVar77,auVar78);
          auVar205._8_4_ = 0x7fffffff;
          auVar205._0_8_ = 0x7fffffff7fffffff;
          auVar205._12_4_ = 0x7fffffff;
          auVar77 = vandps_avx(auVar3,auVar205);
          auVar78 = vandps_avx(auVar85,auVar205);
          auVar77 = vmaxps_avx(auVar77,auVar78);
          auVar78 = vmovshdup_avx(auVar77);
          auVar78 = vmaxss_avx(auVar78,auVar77);
          auVar77 = vshufpd_avx(auVar77,auVar77,1);
          auVar77 = vmaxss_avx(auVar77,auVar78);
          fVar270 = auVar77._0_4_ * 1.9073486e-06;
          local_6e0 = vshufps_avx(auVar85,auVar85,0xff);
          auVar77 = vinsertps_avx(ZEXT416(uVar142),ZEXT416(uVar73),0x10);
          uVar67 = 0;
          while( true ) {
            bVar62 = (byte)uVar72;
            if (uVar67 == 5) break;
            uVar166 = auVar77._0_4_;
            auVar150._4_4_ = uVar166;
            auVar150._0_4_ = uVar166;
            auVar150._8_4_ = uVar166;
            auVar150._12_4_ = uVar166;
            auVar78 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_7d0);
            auVar85 = vmovshdup_avx(auVar77);
            fVar244 = auVar85._0_4_;
            fVar227 = 1.0 - fVar244;
            fVar222 = fVar244 * fVar244;
            auVar81 = SUB6416(ZEXT464(0x40400000),0);
            auVar80 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar76 = vfmadd213ss_fma(auVar81,auVar85,auVar80);
            auVar3 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar222),SUB6416(ZEXT464(0x40000000),0));
            auVar79 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar227),auVar80);
            auVar79 = vfmadd213ss_fma(auVar79,ZEXT416((uint)(fVar227 * fVar227)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar223 = fVar227 * fVar227 * -fVar244 * 0.5;
            fVar224 = auVar3._0_4_ * 0.5;
            fVar225 = auVar79._0_4_ * 0.5;
            fVar226 = fVar244 * fVar244 * -fVar227 * 0.5;
            auVar206._0_4_ = fVar226 * (float)local_7c0._0_4_;
            auVar206._4_4_ = fVar226 * (float)local_7c0._4_4_;
            auVar206._8_4_ = fVar226 * fStack_7b8;
            auVar206._12_4_ = fVar226 * fStack_7b4;
            auVar230._4_4_ = fVar225;
            auVar230._0_4_ = fVar225;
            auVar230._8_4_ = fVar225;
            auVar230._12_4_ = fVar225;
            auVar3 = vfmadd132ps_fma(auVar230,auVar206,local_780._0_16_);
            auVar186._4_4_ = fVar224;
            auVar186._0_4_ = fVar224;
            auVar186._8_4_ = fVar224;
            auVar186._12_4_ = fVar224;
            auVar3 = vfmadd132ps_fma(auVar186,auVar3,local_7a0._0_16_);
            auVar207._4_4_ = fVar223;
            auVar207._0_4_ = fVar223;
            auVar207._8_4_ = fVar223;
            auVar207._12_4_ = fVar223;
            auVar3 = vfmadd132ps_fma(auVar207,auVar3,local_760._0_16_);
            auVar79 = vfmadd231ss_fma(auVar80,auVar85,ZEXT416(0x41100000));
            local_660._0_16_ = auVar79;
            auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar85,ZEXT416(0x40800000));
            local_680._0_16_ = auVar79;
            auVar79 = vfmadd213ss_fma(auVar81,auVar85,ZEXT416(0xbf800000));
            local_6a0._0_16_ = auVar79;
            _local_640 = auVar3;
            auVar3 = vsubps_avx(auVar78,auVar3);
            auVar78 = vdpps_avx(auVar3,auVar3,0x7f);
            fVar223 = auVar78._0_4_;
            local_740 = ZEXT1632(auVar77);
            if (fVar223 < 0.0) {
              local_800._0_4_ = fVar222;
              local_820._0_4_ = fVar227 * -2.0;
              auVar262._0_4_ = sqrtf(fVar223);
              auVar262._4_60_ = extraout_var;
              auVar76 = ZEXT416(auVar76._0_4_);
              auVar77 = auVar262._0_16_;
              uVar72 = extraout_RAX;
            }
            else {
              auVar77 = vsqrtss_avx(auVar78,auVar78);
              local_820._0_4_ = fVar227 * -2.0;
              local_800._0_4_ = fVar222;
            }
            auVar81 = vfnmadd231ss_fma(ZEXT416((uint)(fVar244 * (fVar227 + fVar227))),
                                       ZEXT416((uint)fVar227),ZEXT416((uint)fVar227));
            auVar76 = vfmadd213ss_fma(auVar76,ZEXT416((uint)(fVar244 + fVar244)),
                                      ZEXT416((uint)(fVar244 * fVar244 * 3.0)));
            auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar85,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * fVar227 * -3.0)),
                                      ZEXT416((uint)(fVar227 + fVar227)),auVar79);
            auVar79 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar85,
                                      ZEXT416((uint)local_800._0_4_));
            fVar222 = auVar81._0_4_ * 0.5;
            fVar224 = auVar76._0_4_ * 0.5;
            fVar225 = auVar80._0_4_ * 0.5;
            fVar226 = auVar79._0_4_ * 0.5;
            auVar208._0_4_ = fVar226 * (float)local_7c0._0_4_;
            auVar208._4_4_ = fVar226 * (float)local_7c0._4_4_;
            auVar208._8_4_ = fVar226 * fStack_7b8;
            auVar208._12_4_ = fVar226 * fStack_7b4;
            auVar187._4_4_ = fVar225;
            auVar187._0_4_ = fVar225;
            auVar187._8_4_ = fVar225;
            auVar187._12_4_ = fVar225;
            auVar76 = vfmadd132ps_fma(auVar187,auVar208,local_780._0_16_);
            auVar168._4_4_ = fVar224;
            auVar168._0_4_ = fVar224;
            auVar168._8_4_ = fVar224;
            auVar168._12_4_ = fVar224;
            auVar76 = vfmadd132ps_fma(auVar168,auVar76,local_7a0._0_16_);
            auVar264._4_4_ = fVar222;
            auVar264._0_4_ = fVar222;
            auVar264._8_4_ = fVar222;
            auVar264._12_4_ = fVar222;
            auVar76 = vfmadd132ps_fma(auVar264,auVar76,local_760._0_16_);
            local_800._0_16_ = vdpps_avx(auVar76,auVar76,0x7f);
            auVar55._12_4_ = 0;
            auVar55._0_12_ = ZEXT812(0);
            fVar222 = local_800._0_4_;
            auVar79 = vrsqrt14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar222));
            fVar224 = auVar79._0_4_;
            local_820._0_16_ = vrcp14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar222));
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar80 = vxorps_avx512vl(local_800._0_16_,auVar22);
            auVar79 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            uVar73 = auVar77._0_4_;
            if (fVar222 < auVar80._0_4_) {
              fVar225 = sqrtf(fVar222);
              auVar77 = ZEXT416(uVar73);
              uVar72 = extraout_RAX_00;
            }
            else {
              auVar80 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
              fVar225 = auVar80._0_4_;
            }
            fVar222 = fVar224 * 1.5 + fVar222 * -0.5 * fVar224 * fVar224 * fVar224;
            auVar151._0_4_ = auVar76._0_4_ * fVar222;
            auVar151._4_4_ = auVar76._4_4_ * fVar222;
            auVar151._8_4_ = auVar76._8_4_ * fVar222;
            auVar151._12_4_ = auVar76._12_4_ * fVar222;
            auVar80 = vdpps_avx(auVar3,auVar151,0x7f);
            fVar227 = auVar77._0_4_;
            fVar224 = auVar80._0_4_;
            auVar152._0_4_ = fVar224 * fVar224;
            auVar152._4_4_ = auVar80._4_4_ * auVar80._4_4_;
            auVar152._8_4_ = auVar80._8_4_ * auVar80._8_4_;
            auVar152._12_4_ = auVar80._12_4_ * auVar80._12_4_;
            auVar81 = vsubps_avx512vl(auVar78,auVar152);
            fVar226 = auVar81._0_4_;
            auVar169._4_12_ = ZEXT812(0) << 0x20;
            auVar169._0_4_ = fVar226;
            auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
            auVar83 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
            if (fVar226 < 0.0) {
              local_6d0 = fVar222;
              fStack_6cc = fVar222;
              fStack_6c8 = fVar222;
              fStack_6c4 = fVar222;
              local_6c0 = auVar82;
              fVar226 = sqrtf(fVar226);
              auVar83 = ZEXT416(auVar83._0_4_);
              auVar77 = ZEXT416(uVar73);
              uVar72 = extraout_RAX_01;
              auVar81 = local_6c0;
              fVar222 = local_6d0;
              fVar244 = fStack_6cc;
              fVar245 = fStack_6c8;
              fVar246 = fStack_6c4;
            }
            else {
              auVar81 = vsqrtss_avx(auVar81,auVar81);
              fVar226 = auVar81._0_4_;
              auVar81 = auVar82;
              fVar244 = fVar222;
              fVar245 = fVar222;
              fVar246 = fVar222;
            }
            auVar262 = ZEXT1664(auVar3);
            auVar108 = vmovdqa64_avx512vl(auVar103);
            auVar271 = ZEXT3264(auVar108);
            auVar108 = vmovdqa64_avx512vl(auVar105);
            auVar272 = ZEXT3264(auVar108);
            auVar170._0_4_ = (float)local_6a0._0_4_ * (float)local_7c0._0_4_;
            auVar170._4_4_ = (float)local_6a0._0_4_ * (float)local_7c0._4_4_;
            auVar170._8_4_ = (float)local_6a0._0_4_ * fStack_7b8;
            auVar170._12_4_ = (float)local_6a0._0_4_ * fStack_7b4;
            auVar188._4_4_ = local_680._0_4_;
            auVar188._0_4_ = local_680._0_4_;
            auVar188._8_4_ = local_680._0_4_;
            auVar188._12_4_ = local_680._0_4_;
            auVar167 = vfmadd132ps_fma(auVar188,auVar170,local_780._0_16_);
            auVar171._4_4_ = local_660._0_4_;
            auVar171._0_4_ = local_660._0_4_;
            auVar171._8_4_ = local_660._0_4_;
            auVar171._12_4_ = local_660._0_4_;
            auVar167 = vfmadd132ps_fma(auVar171,auVar167,local_7a0._0_16_);
            auVar85 = vfmadd213ss_fma(auVar85,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar166 = auVar85._0_4_;
            auVar189._4_4_ = uVar166;
            auVar189._0_4_ = uVar166;
            auVar189._8_4_ = uVar166;
            auVar189._12_4_ = uVar166;
            auVar85 = vfmadd132ps_fma(auVar189,auVar167,local_760._0_16_);
            auVar172._0_4_ = auVar85._0_4_ * (float)local_800._0_4_;
            auVar172._4_4_ = auVar85._4_4_ * (float)local_800._0_4_;
            auVar172._8_4_ = auVar85._8_4_ * (float)local_800._0_4_;
            auVar172._12_4_ = auVar85._12_4_ * (float)local_800._0_4_;
            auVar85 = vdpps_avx(auVar76,auVar85,0x7f);
            fVar184 = auVar85._0_4_;
            auVar190._0_4_ = auVar76._0_4_ * fVar184;
            auVar190._4_4_ = auVar76._4_4_ * fVar184;
            auVar190._8_4_ = auVar76._8_4_ * fVar184;
            auVar190._12_4_ = auVar76._12_4_ * fVar184;
            auVar85 = vsubps_avx(auVar172,auVar190);
            fVar184 = auVar79._0_4_ * (float)local_820._0_4_;
            auVar167 = vmaxss_avx(ZEXT416((uint)fVar270),
                                  ZEXT416((uint)(local_740._0_4_ * fVar228 * 1.9073486e-06)));
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar84 = vxorps_avx512vl(auVar76,auVar23);
            auVar191._0_4_ = fVar222 * auVar85._0_4_ * fVar184;
            auVar191._4_4_ = fVar244 * auVar85._4_4_ * fVar184;
            auVar191._8_4_ = fVar245 * auVar85._8_4_ * fVar184;
            auVar191._12_4_ = fVar246 * auVar85._12_4_ * fVar184;
            auVar263 = ZEXT1664(auVar151);
            auVar85 = vdpps_avx(auVar84,auVar151,0x7f);
            auVar79 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar270),auVar167);
            auVar77 = vdpps_avx(auVar3,auVar191,0x7f);
            auVar185 = vfmadd213ss_fma(ZEXT416((uint)(fVar227 + 1.0)),
                                       ZEXT416((uint)(fVar270 / fVar225)),auVar79);
            fVar222 = auVar85._0_4_ + auVar77._0_4_;
            auVar77 = vdpps_avx(local_7d0,auVar151,0x7f);
            auVar85 = vdpps_avx(auVar3,auVar84,0x7f);
            auVar79 = vmulss_avx512f(auVar83,auVar81);
            fVar225 = auVar82._0_4_ * 1.5 + auVar79._0_4_ * auVar81._0_4_ * auVar81._0_4_;
            auVar79 = vdpps_avx(auVar3,local_7d0,0x7f);
            auVar82 = vfnmadd231ss_fma(auVar85,auVar80,ZEXT416((uint)fVar222));
            auVar79 = vfnmadd231ss_fma(auVar79,auVar80,auVar77);
            auVar85 = vpermilps_avx(_local_640,0xff);
            fVar226 = fVar226 - auVar85._0_4_;
            auVar81 = vshufps_avx(auVar76,auVar76,0xff);
            auVar85 = vfmsub213ss_fma(auVar82,ZEXT416((uint)fVar225),auVar81);
            auVar255._8_4_ = 0x80000000;
            auVar255._0_8_ = 0x8000000080000000;
            auVar255._12_4_ = 0x80000000;
            auVar258 = ZEXT1664(auVar255);
            auVar250._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
            auVar250._8_4_ = auVar85._8_4_ ^ 0x80000000;
            auVar250._12_4_ = auVar85._12_4_ ^ 0x80000000;
            auVar253 = ZEXT1664(auVar250);
            auVar79 = ZEXT416((uint)(auVar79._0_4_ * fVar225));
            auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar85._0_4_)),
                                      ZEXT416((uint)fVar222),auVar79);
            auVar85 = vinsertps_avx(auVar250,auVar79,0x1c);
            auVar237._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
            auVar237._8_4_ = auVar77._8_4_ ^ 0x80000000;
            auVar237._12_4_ = auVar77._12_4_ ^ 0x80000000;
            auVar79 = vinsertps_avx(ZEXT416((uint)fVar222),auVar237,0x10);
            auVar209._0_4_ = auVar82._0_4_;
            auVar209._4_4_ = auVar209._0_4_;
            auVar209._8_4_ = auVar209._0_4_;
            auVar209._12_4_ = auVar209._0_4_;
            auVar77 = vdivps_avx(auVar85,auVar209);
            auVar85 = vdivps_avx(auVar79,auVar209);
            auVar210._0_4_ = fVar224 * auVar77._0_4_ + fVar226 * auVar85._0_4_;
            auVar210._4_4_ = fVar224 * auVar77._4_4_ + fVar226 * auVar85._4_4_;
            auVar210._8_4_ = fVar224 * auVar77._8_4_ + fVar226 * auVar85._8_4_;
            auVar210._12_4_ = fVar224 * auVar77._12_4_ + fVar226 * auVar85._12_4_;
            auVar77 = vsubps_avx(local_740._0_16_,auVar210);
            auVar24._8_4_ = 0x7fffffff;
            auVar24._0_8_ = 0x7fffffff7fffffff;
            auVar24._12_4_ = 0x7fffffff;
            auVar85 = vandps_avx512vl(auVar80,auVar24);
            if (auVar85._0_4_ < auVar185._0_4_) {
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar185._0_4_ + auVar167._0_4_)),local_6e0,
                                        ZEXT416(0x36000000));
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(ZEXT416((uint)fVar226),auVar25);
              if (auVar79._0_4_ < auVar85._0_4_) {
                bVar71 = uVar67 < 5;
                fVar228 = auVar77._0_4_ + (float)local_6f0._0_4_;
                if ((fVar2 <= fVar228) &&
                   (fVar270 = *(float *)(ray + k * 4 + 0x100), fVar228 <= fVar270)) {
                  auVar85 = vmovshdup_avx(auVar77);
                  bVar62 = 0;
                  if ((auVar85._0_4_ < 0.0) || (1.0 < auVar85._0_4_)) goto LAB_01ba1a1a;
                  auVar211._0_12_ = ZEXT812(0);
                  auVar211._12_4_ = 0;
                  auVar137._0_16_ = auVar211;
                  auVar136._4_28_ = auVar137._4_28_;
                  auVar136._0_4_ = fVar223;
                  auVar85 = vrsqrt14ss_avx512f(auVar211,auVar136._0_16_);
                  fVar222 = auVar85._0_4_;
                  auVar78 = vmulss_avx512f(auVar78,ZEXT416(0xbf000000));
                  pGVar5 = (context->scene->geometries).items[uVar4].ptr;
                  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar62 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01ba1a1a;
                    fVar222 = fVar222 * 1.5 + auVar78._0_4_ * fVar222 * fVar222 * fVar222;
                    auVar192._0_4_ = auVar3._0_4_ * fVar222;
                    auVar192._4_4_ = auVar3._4_4_ * fVar222;
                    auVar192._8_4_ = auVar3._8_4_ * fVar222;
                    auVar192._12_4_ = auVar3._12_4_ * fVar222;
                    auVar79 = vfmadd213ps_fma(auVar81,auVar192,auVar76);
                    auVar78 = vshufps_avx(auVar192,auVar192,0xc9);
                    auVar85 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar193._0_4_ = auVar192._0_4_ * auVar85._0_4_;
                    auVar193._4_4_ = auVar192._4_4_ * auVar85._4_4_;
                    auVar193._8_4_ = auVar192._8_4_ * auVar85._8_4_;
                    auVar193._12_4_ = auVar192._12_4_ * auVar85._12_4_;
                    auVar76 = vfmsub231ps_fma(auVar193,auVar76,auVar78);
                    auVar78 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar85 = vshufps_avx(auVar79,auVar79,0xc9);
                    auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                    auVar153._0_4_ = auVar79._0_4_ * auVar76._0_4_;
                    auVar153._4_4_ = auVar79._4_4_ * auVar76._4_4_;
                    auVar153._8_4_ = auVar79._8_4_ * auVar76._8_4_;
                    auVar153._12_4_ = auVar79._12_4_ * auVar76._12_4_;
                    auVar78 = vfmsub231ps_fma(auVar153,auVar78,auVar85);
                    auVar219._8_4_ = 1;
                    auVar219._0_8_ = 0x100000001;
                    auVar219._12_4_ = 1;
                    auVar219._16_4_ = 1;
                    auVar219._20_4_ = 1;
                    auVar219._24_4_ = 1;
                    auVar219._28_4_ = 1;
                    local_460 = vpermps_avx2(auVar219,ZEXT1632(auVar77));
                    auVar108 = vpermps_avx2(auVar219,ZEXT1632(auVar78));
                    auVar235._8_4_ = 2;
                    auVar235._0_8_ = 0x200000002;
                    auVar235._12_4_ = 2;
                    auVar235._16_4_ = 2;
                    auVar235._20_4_ = 2;
                    auVar235._24_4_ = 2;
                    auVar235._28_4_ = 2;
                    local_4a0 = vpermps_avx2(auVar235,ZEXT1632(auVar78));
                    local_480 = auVar78._0_4_;
                    local_4c0[0] = (RTCHitN)auVar108[0];
                    local_4c0[1] = (RTCHitN)auVar108[1];
                    local_4c0[2] = (RTCHitN)auVar108[2];
                    local_4c0[3] = (RTCHitN)auVar108[3];
                    local_4c0[4] = (RTCHitN)auVar108[4];
                    local_4c0[5] = (RTCHitN)auVar108[5];
                    local_4c0[6] = (RTCHitN)auVar108[6];
                    local_4c0[7] = (RTCHitN)auVar108[7];
                    local_4c0[8] = (RTCHitN)auVar108[8];
                    local_4c0[9] = (RTCHitN)auVar108[9];
                    local_4c0[10] = (RTCHitN)auVar108[10];
                    local_4c0[0xb] = (RTCHitN)auVar108[0xb];
                    local_4c0[0xc] = (RTCHitN)auVar108[0xc];
                    local_4c0[0xd] = (RTCHitN)auVar108[0xd];
                    local_4c0[0xe] = (RTCHitN)auVar108[0xe];
                    local_4c0[0xf] = (RTCHitN)auVar108[0xf];
                    local_4c0[0x10] = (RTCHitN)auVar108[0x10];
                    local_4c0[0x11] = (RTCHitN)auVar108[0x11];
                    local_4c0[0x12] = (RTCHitN)auVar108[0x12];
                    local_4c0[0x13] = (RTCHitN)auVar108[0x13];
                    local_4c0[0x14] = (RTCHitN)auVar108[0x14];
                    local_4c0[0x15] = (RTCHitN)auVar108[0x15];
                    local_4c0[0x16] = (RTCHitN)auVar108[0x16];
                    local_4c0[0x17] = (RTCHitN)auVar108[0x17];
                    local_4c0[0x18] = (RTCHitN)auVar108[0x18];
                    local_4c0[0x19] = (RTCHitN)auVar108[0x19];
                    local_4c0[0x1a] = (RTCHitN)auVar108[0x1a];
                    local_4c0[0x1b] = (RTCHitN)auVar108[0x1b];
                    local_4c0[0x1c] = (RTCHitN)auVar108[0x1c];
                    local_4c0[0x1d] = (RTCHitN)auVar108[0x1d];
                    local_4c0[0x1e] = (RTCHitN)auVar108[0x1e];
                    local_4c0[0x1f] = (RTCHitN)auVar108[0x1f];
                    uStack_47c = local_480;
                    uStack_478 = local_480;
                    uStack_474 = local_480;
                    uStack_470 = local_480;
                    uStack_46c = local_480;
                    uStack_468 = local_480;
                    uStack_464 = local_480;
                    local_440 = ZEXT432(0) << 0x20;
                    local_420 = local_4e0._0_8_;
                    uStack_418 = local_4e0._8_8_;
                    uStack_410 = local_4e0._16_8_;
                    uStack_408 = local_4e0._24_8_;
                    local_400 = local_500;
                    vpcmpeqd_avx2(local_500,local_500);
                    local_3e0 = context->user->instID[0];
                    uStack_3dc = local_3e0;
                    uStack_3d8 = local_3e0;
                    uStack_3d4 = local_3e0;
                    uStack_3d0 = local_3e0;
                    uStack_3cc = local_3e0;
                    uStack_3c8 = local_3e0;
                    uStack_3c4 = local_3e0;
                    local_3c0 = context->user->instPrimID[0];
                    uStack_3bc = local_3c0;
                    uStack_3b8 = local_3c0;
                    uStack_3b4 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3ac = local_3c0;
                    uStack_3a8 = local_3c0;
                    uStack_3a4 = local_3c0;
                    *(float *)(ray + k * 4 + 0x100) = fVar228;
                    local_720 = local_540;
                    local_850.valid = (int *)local_720;
                    local_850.geometryUserPtr = pGVar5->userPtr;
                    local_850.context = context->user;
                    local_850.hit = local_4c0;
                    local_850.N = 8;
                    local_850.ray = (RTCRayN *)ray;
                    if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar253 = ZEXT1664(auVar250);
                      auVar258 = ZEXT1664(auVar255);
                      auVar262 = ZEXT1664(auVar3);
                      auVar263 = ZEXT1664(auVar151);
                      (*pGVar5->occlusionFilterN)(&local_850);
                      auVar108 = vmovdqa64_avx512vl(auVar105);
                      auVar272 = ZEXT3264(auVar108);
                      auVar108 = vmovdqa64_avx512vl(auVar103);
                      auVar271 = ZEXT3264(auVar108);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        auVar258 = ZEXT1664(auVar258._0_16_);
                        auVar262 = ZEXT1664(auVar262._0_16_);
                        auVar263 = ZEXT1664(auVar263._0_16_);
                        (*p_Var9)(&local_850);
                        auVar108 = vmovdqa64_avx512vl(auVar105);
                        auVar272 = ZEXT3264(auVar108);
                        auVar108 = vmovdqa64_avx512vl(auVar103);
                        auVar271 = ZEXT3264(auVar108);
                      }
                      uVar72 = vptestmd_avx512vl(local_720,local_720);
                      auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar10 = (bool)((byte)uVar72 & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar17 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_850.ray + 0x100) =
                           (uint)bVar10 * auVar108._0_4_ |
                           (uint)!bVar10 * *(int *)(local_850.ray + 0x100);
                      *(uint *)(local_850.ray + 0x104) =
                           (uint)bVar11 * auVar108._4_4_ |
                           (uint)!bVar11 * *(int *)(local_850.ray + 0x104);
                      *(uint *)(local_850.ray + 0x108) =
                           (uint)bVar12 * auVar108._8_4_ |
                           (uint)!bVar12 * *(int *)(local_850.ray + 0x108);
                      *(uint *)(local_850.ray + 0x10c) =
                           (uint)bVar13 * auVar108._12_4_ |
                           (uint)!bVar13 * *(int *)(local_850.ray + 0x10c);
                      *(uint *)(local_850.ray + 0x110) =
                           (uint)bVar14 * auVar108._16_4_ |
                           (uint)!bVar14 * *(int *)(local_850.ray + 0x110);
                      *(uint *)(local_850.ray + 0x114) =
                           (uint)bVar15 * auVar108._20_4_ |
                           (uint)!bVar15 * *(int *)(local_850.ray + 0x114);
                      *(uint *)(local_850.ray + 0x118) =
                           (uint)bVar16 * auVar108._24_4_ |
                           (uint)!bVar16 * *(int *)(local_850.ray + 0x118);
                      *(uint *)(local_850.ray + 0x11c) =
                           (uint)bVar17 * auVar108._28_4_ |
                           (uint)!bVar17 * *(int *)(local_850.ray + 0x11c);
                      bVar62 = 1;
                      if (local_720 != (undefined1  [32])0x0) goto LAB_01ba1a1a;
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar270;
                    bVar62 = 0;
                    goto LAB_01ba1a1a;
                  }
                }
                bVar62 = 0;
                goto LAB_01ba1a1a;
              }
            }
            uVar67 = uVar67 + 1;
          }
          bVar71 = false;
LAB_01ba1a1a:
          bVar63 = bVar63 | bVar71 & bVar62;
          uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar239._4_4_ = uVar166;
          auVar239._0_4_ = uVar166;
          auVar239._8_4_ = uVar166;
          auVar239._12_4_ = uVar166;
          auVar239._16_4_ = uVar166;
          auVar239._20_4_ = uVar166;
          auVar239._24_4_ = uVar166;
          auVar239._28_4_ = uVar166;
          auVar241 = ZEXT3264(auVar239);
          auVar57._4_4_ = fStack_57c;
          auVar57._0_4_ = local_580;
          auVar57._8_4_ = fStack_578;
          auVar57._12_4_ = fStack_574;
          auVar57._16_4_ = fStack_570;
          auVar57._20_4_ = fStack_56c;
          auVar57._24_4_ = fStack_568;
          auVar57._28_4_ = fStack_564;
          uVar18 = vcmpps_avx512vl(auVar239,auVar57,0xd);
        }
        auVar162._0_4_ = (float)local_5c0._0_4_ + (float)local_5a0._0_4_;
        auVar162._4_4_ = (float)local_5c0._4_4_ + (float)local_5a0._4_4_;
        auVar162._8_4_ = fStack_5b8 + fStack_598;
        auVar162._12_4_ = fStack_5b4 + fStack_594;
        auVar162._16_4_ = fStack_5b0 + fStack_590;
        auVar162._20_4_ = fStack_5ac + fStack_58c;
        auVar162._24_4_ = fStack_5a8 + fStack_588;
        auVar162._28_4_ = fStack_5a4 + fStack_584;
        uVar166 = auVar241._0_4_;
        auVar180._4_4_ = uVar166;
        auVar180._0_4_ = uVar166;
        auVar180._8_4_ = uVar166;
        auVar180._12_4_ = uVar166;
        auVar180._16_4_ = uVar166;
        auVar180._20_4_ = uVar166;
        auVar180._24_4_ = uVar166;
        auVar180._28_4_ = uVar166;
        uVar18 = vcmpps_avx512vl(auVar162,auVar180,2);
        auVar163._8_4_ = 2;
        auVar163._0_8_ = 0x200000002;
        auVar163._12_4_ = 2;
        auVar163._16_4_ = 2;
        auVar163._20_4_ = 2;
        auVar163._24_4_ = 2;
        auVar163._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar109 = vpblendmd_avx512vl(auVar163,auVar35);
        local_5a0._0_4_ = (uint)(bVar61 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
        bVar71 = (bool)(bVar61 >> 1 & 1);
        local_5a0._4_4_ = (uint)bVar71 * auVar109._4_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar61 >> 2 & 1);
        fStack_598 = (float)((uint)bVar71 * auVar109._8_4_ | (uint)!bVar71 * 2);
        bVar71 = (bool)(bVar61 >> 3 & 1);
        fStack_594 = (float)((uint)bVar71 * auVar109._12_4_ | (uint)!bVar71 * 2);
        bVar71 = (bool)(bVar61 >> 4 & 1);
        fStack_590 = (float)((uint)bVar71 * auVar109._16_4_ | (uint)!bVar71 * 2);
        bVar71 = (bool)(bVar61 >> 5 & 1);
        fStack_58c = (float)((uint)bVar71 * auVar109._20_4_ | (uint)!bVar71 * 2);
        bVar71 = (bool)(bVar61 >> 6 & 1);
        fStack_588 = (float)((uint)bVar71 * auVar109._24_4_ | (uint)!bVar71 * 2);
        fStack_584 = (float)((uint)(bVar61 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2)
        ;
        bVar60 = (byte)uVar19 & bVar60 & (byte)uVar18;
        uVar18 = vpcmpd_avx512vl(_local_5a0,local_520,2);
        local_580 = (float)local_5c0._0_4_ + (float)local_3a0._0_4_;
        fStack_57c = (float)local_5c0._4_4_ + (float)local_3a0._4_4_;
        fStack_578 = fStack_5b8 + fStack_398;
        fStack_574 = fStack_5b4 + fStack_394;
        fStack_570 = fStack_5b0 + fStack_390;
        fStack_56c = fStack_5ac + fStack_38c;
        fStack_568 = fStack_5a8 + fStack_388;
        fStack_564 = fStack_5a4 + fStack_384;
        for (bVar68 = (byte)uVar18 & bVar60; bVar68 != 0; bVar68 = ~bVar61 & bVar68 & (byte)uVar18)
        {
          auVar164._8_4_ = 0x7f800000;
          auVar164._0_8_ = 0x7f8000007f800000;
          auVar164._12_4_ = 0x7f800000;
          auVar164._16_4_ = 0x7f800000;
          auVar164._20_4_ = 0x7f800000;
          auVar164._24_4_ = 0x7f800000;
          auVar164._28_4_ = 0x7f800000;
          auVar109 = vblendmps_avx512vl(auVar164,auVar108);
          auVar138._0_4_ =
               (uint)(bVar68 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 1 & 1);
          auVar138._4_4_ = (uint)bVar71 * auVar109._4_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 2 & 1);
          auVar138._8_4_ = (uint)bVar71 * auVar109._8_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 3 & 1);
          auVar138._12_4_ = (uint)bVar71 * auVar109._12_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 4 & 1);
          auVar138._16_4_ = (uint)bVar71 * auVar109._16_4_ | (uint)!bVar71 * 0x7f800000;
          bVar71 = (bool)(bVar68 >> 5 & 1);
          auVar138._20_4_ = (uint)bVar71 * auVar109._20_4_ | (uint)!bVar71 * 0x7f800000;
          auVar138._24_4_ =
               (uint)(bVar68 >> 6) * auVar109._24_4_ | (uint)!(bool)(bVar68 >> 6) * 0x7f800000;
          auVar138._28_4_ = 0x7f800000;
          auVar109 = vshufps_avx(auVar138,auVar138,0xb1);
          auVar109 = vminps_avx(auVar138,auVar109);
          auVar86 = vshufpd_avx(auVar109,auVar109,5);
          auVar109 = vminps_avx(auVar109,auVar86);
          auVar86 = vpermpd_avx2(auVar109,0x4e);
          auVar109 = vminps_avx(auVar109,auVar86);
          uVar18 = vcmpps_avx512vl(auVar138,auVar109,0);
          bVar66 = (byte)uVar18 & bVar68;
          bVar61 = bVar68;
          if (bVar66 != 0) {
            bVar61 = bVar66;
          }
          iVar21 = 0;
          for (uVar73 = (uint)bVar61; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
            iVar21 = iVar21 + 1;
          }
          bVar61 = '\x01' << ((byte)iVar21 & 0x1f);
          uVar73 = *(uint *)(local_200 + (uint)(iVar21 << 2));
          uVar142 = *(uint *)(local_380 + (uint)(iVar21 << 2));
          fVar228 = auVar75._0_4_;
          if ((float)local_7e0._0_4_ < 0.0) {
            auVar258 = ZEXT1664(auVar258._0_16_);
            auVar262 = ZEXT1664(auVar262._0_16_);
            auVar263 = ZEXT1664(auVar263._0_16_);
            fVar228 = sqrtf((float)local_7e0._0_4_);
            auVar109 = vmovdqa64_avx512vl(auVar105);
            auVar272 = ZEXT3264(auVar109);
            auVar109 = vmovdqa64_avx512vl(auVar103);
            auVar271 = ZEXT3264(auVar109);
          }
          auVar253 = ZEXT464(uVar142);
          uVar72 = (ulong)bVar61;
          auVar78 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar77 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar85 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar3 = vminps_avx(auVar78,auVar85);
          auVar78 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar85 = vmaxps_avx(auVar77,auVar78);
          auVar212._8_4_ = 0x7fffffff;
          auVar212._0_8_ = 0x7fffffff7fffffff;
          auVar212._12_4_ = 0x7fffffff;
          auVar77 = vandps_avx(auVar3,auVar212);
          auVar78 = vandps_avx(auVar85,auVar212);
          auVar77 = vmaxps_avx(auVar77,auVar78);
          auVar78 = vmovshdup_avx(auVar77);
          auVar78 = vmaxss_avx(auVar78,auVar77);
          auVar77 = vshufpd_avx(auVar77,auVar77,1);
          auVar77 = vmaxss_avx(auVar77,auVar78);
          fVar270 = auVar77._0_4_ * 1.9073486e-06;
          local_6e0 = vshufps_avx(auVar85,auVar85,0xff);
          auVar77 = vinsertps_avx(ZEXT416(uVar142),ZEXT416(uVar73),0x10);
          uVar67 = 0;
          while( true ) {
            bVar66 = (byte)uVar72;
            if (uVar67 == 5) break;
            uVar166 = auVar77._0_4_;
            auVar154._4_4_ = uVar166;
            auVar154._0_4_ = uVar166;
            auVar154._8_4_ = uVar166;
            auVar154._12_4_ = uVar166;
            auVar78 = vfmadd132ps_fma(auVar154,ZEXT816(0) << 0x40,local_7d0);
            auVar85 = vmovshdup_avx(auVar77);
            fVar244 = auVar85._0_4_;
            fVar227 = 1.0 - fVar244;
            fVar222 = fVar244 * fVar244;
            auVar81 = SUB6416(ZEXT464(0x40400000),0);
            auVar80 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar76 = vfmadd213ss_fma(auVar81,auVar85,auVar80);
            auVar3 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar222),SUB6416(ZEXT464(0x40000000),0));
            auVar79 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar227),auVar80);
            auVar79 = vfmadd213ss_fma(auVar79,ZEXT416((uint)(fVar227 * fVar227)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar223 = fVar227 * fVar227 * -fVar244 * 0.5;
            fVar224 = auVar3._0_4_ * 0.5;
            fVar225 = auVar79._0_4_ * 0.5;
            fVar226 = fVar244 * fVar244 * -fVar227 * 0.5;
            auVar213._0_4_ = fVar226 * (float)local_7c0._0_4_;
            auVar213._4_4_ = fVar226 * (float)local_7c0._4_4_;
            auVar213._8_4_ = fVar226 * fStack_7b8;
            auVar213._12_4_ = fVar226 * fStack_7b4;
            auVar231._4_4_ = fVar225;
            auVar231._0_4_ = fVar225;
            auVar231._8_4_ = fVar225;
            auVar231._12_4_ = fVar225;
            auVar3 = vfmadd132ps_fma(auVar231,auVar213,local_780._0_16_);
            auVar194._4_4_ = fVar224;
            auVar194._0_4_ = fVar224;
            auVar194._8_4_ = fVar224;
            auVar194._12_4_ = fVar224;
            auVar3 = vfmadd132ps_fma(auVar194,auVar3,local_7a0._0_16_);
            auVar214._4_4_ = fVar223;
            auVar214._0_4_ = fVar223;
            auVar214._8_4_ = fVar223;
            auVar214._12_4_ = fVar223;
            auVar3 = vfmadd132ps_fma(auVar214,auVar3,local_760._0_16_);
            auVar79 = vfmadd231ss_fma(auVar80,auVar85,ZEXT416(0x41100000));
            local_660._0_16_ = auVar79;
            auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar85,ZEXT416(0x40800000));
            local_680._0_16_ = auVar79;
            auVar79 = vfmadd213ss_fma(auVar81,auVar85,ZEXT416(0xbf800000));
            local_6a0._0_16_ = auVar79;
            _local_640 = auVar3;
            auVar3 = vsubps_avx(auVar78,auVar3);
            auVar78 = vdpps_avx(auVar3,auVar3,0x7f);
            fVar223 = auVar78._0_4_;
            local_740 = ZEXT1632(auVar77);
            if (fVar223 < 0.0) {
              local_800._0_4_ = fVar222;
              local_820._0_4_ = fVar227 * -2.0;
              auVar263._0_4_ = sqrtf(fVar223);
              auVar263._4_60_ = extraout_var_00;
              auVar76 = ZEXT416(auVar76._0_4_);
              auVar77 = auVar263._0_16_;
              uVar72 = extraout_RAX_02;
            }
            else {
              auVar77 = vsqrtss_avx(auVar78,auVar78);
              local_820._0_4_ = fVar227 * -2.0;
              local_800._0_4_ = fVar222;
            }
            auVar81 = vfnmadd231ss_fma(ZEXT416((uint)(fVar244 * (fVar227 + fVar227))),
                                       ZEXT416((uint)fVar227),ZEXT416((uint)fVar227));
            auVar76 = vfmadd213ss_fma(auVar76,ZEXT416((uint)(fVar244 + fVar244)),
                                      ZEXT416((uint)(fVar244 * fVar244 * 3.0)));
            auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar85,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * fVar227 * -3.0)),
                                      ZEXT416((uint)(fVar227 + fVar227)),auVar79);
            auVar79 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar85,
                                      ZEXT416((uint)local_800._0_4_));
            fVar222 = auVar81._0_4_ * 0.5;
            fVar224 = auVar76._0_4_ * 0.5;
            fVar225 = auVar80._0_4_ * 0.5;
            fVar226 = auVar79._0_4_ * 0.5;
            auVar215._0_4_ = fVar226 * (float)local_7c0._0_4_;
            auVar215._4_4_ = fVar226 * (float)local_7c0._4_4_;
            auVar215._8_4_ = fVar226 * fStack_7b8;
            auVar215._12_4_ = fVar226 * fStack_7b4;
            auVar195._4_4_ = fVar225;
            auVar195._0_4_ = fVar225;
            auVar195._8_4_ = fVar225;
            auVar195._12_4_ = fVar225;
            auVar76 = vfmadd132ps_fma(auVar195,auVar215,local_780._0_16_);
            auVar173._4_4_ = fVar224;
            auVar173._0_4_ = fVar224;
            auVar173._8_4_ = fVar224;
            auVar173._12_4_ = fVar224;
            auVar76 = vfmadd132ps_fma(auVar173,auVar76,local_7a0._0_16_);
            auVar265._4_4_ = fVar222;
            auVar265._0_4_ = fVar222;
            auVar265._8_4_ = fVar222;
            auVar265._12_4_ = fVar222;
            auVar76 = vfmadd132ps_fma(auVar265,auVar76,local_760._0_16_);
            local_800._0_16_ = vdpps_avx(auVar76,auVar76,0x7f);
            auVar56._12_4_ = 0;
            auVar56._0_12_ = ZEXT812(0);
            fVar222 = local_800._0_4_;
            auVar79 = vrsqrt14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar222));
            fVar224 = auVar79._0_4_;
            local_820._0_16_ = vrcp14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar222));
            auVar26._8_4_ = 0x80000000;
            auVar26._0_8_ = 0x8000000080000000;
            auVar26._12_4_ = 0x80000000;
            auVar80 = vxorps_avx512vl(local_800._0_16_,auVar26);
            auVar79 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            uVar73 = auVar77._0_4_;
            if (fVar222 < auVar80._0_4_) {
              fVar225 = sqrtf(fVar222);
              auVar77 = ZEXT416(uVar73);
              uVar72 = extraout_RAX_03;
            }
            else {
              auVar80 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
              fVar225 = auVar80._0_4_;
            }
            fVar222 = fVar224 * 1.5 + fVar222 * -0.5 * fVar224 * fVar224 * fVar224;
            auVar155._0_4_ = auVar76._0_4_ * fVar222;
            auVar155._4_4_ = auVar76._4_4_ * fVar222;
            auVar155._8_4_ = auVar76._8_4_ * fVar222;
            auVar155._12_4_ = auVar76._12_4_ * fVar222;
            auVar80 = vdpps_avx(auVar3,auVar155,0x7f);
            fVar227 = auVar77._0_4_;
            fVar224 = auVar80._0_4_;
            auVar156._0_4_ = fVar224 * fVar224;
            auVar156._4_4_ = auVar80._4_4_ * auVar80._4_4_;
            auVar156._8_4_ = auVar80._8_4_ * auVar80._8_4_;
            auVar156._12_4_ = auVar80._12_4_ * auVar80._12_4_;
            auVar81 = vsubps_avx512vl(auVar78,auVar156);
            fVar226 = auVar81._0_4_;
            auVar174._4_12_ = ZEXT812(0) << 0x20;
            auVar174._0_4_ = fVar226;
            auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
            auVar83 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
            if (fVar226 < 0.0) {
              local_6d0 = fVar222;
              fStack_6cc = fVar222;
              fStack_6c8 = fVar222;
              fStack_6c4 = fVar222;
              local_6c0 = auVar82;
              fVar226 = sqrtf(fVar226);
              auVar83 = ZEXT416(auVar83._0_4_);
              auVar77 = ZEXT416(uVar73);
              uVar72 = extraout_RAX_04;
              auVar81 = local_6c0;
              fVar222 = local_6d0;
              fVar244 = fStack_6cc;
              fVar245 = fStack_6c8;
              fVar246 = fStack_6c4;
            }
            else {
              auVar81 = vsqrtss_avx(auVar81,auVar81);
              fVar226 = auVar81._0_4_;
              auVar81 = auVar82;
              fVar244 = fVar222;
              fVar245 = fVar222;
              fVar246 = fVar222;
            }
            auVar262 = ZEXT1664(auVar3);
            auVar109 = vmovdqa64_avx512vl(auVar103);
            auVar271 = ZEXT3264(auVar109);
            auVar109 = vmovdqa64_avx512vl(auVar105);
            auVar272 = ZEXT3264(auVar109);
            auVar175._0_4_ = (float)local_6a0._0_4_ * (float)local_7c0._0_4_;
            auVar175._4_4_ = (float)local_6a0._0_4_ * (float)local_7c0._4_4_;
            auVar175._8_4_ = (float)local_6a0._0_4_ * fStack_7b8;
            auVar175._12_4_ = (float)local_6a0._0_4_ * fStack_7b4;
            auVar196._4_4_ = local_680._0_4_;
            auVar196._0_4_ = local_680._0_4_;
            auVar196._8_4_ = local_680._0_4_;
            auVar196._12_4_ = local_680._0_4_;
            auVar167 = vfmadd132ps_fma(auVar196,auVar175,local_780._0_16_);
            auVar176._4_4_ = local_660._0_4_;
            auVar176._0_4_ = local_660._0_4_;
            auVar176._8_4_ = local_660._0_4_;
            auVar176._12_4_ = local_660._0_4_;
            auVar167 = vfmadd132ps_fma(auVar176,auVar167,local_7a0._0_16_);
            auVar85 = vfmadd213ss_fma(auVar85,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar166 = auVar85._0_4_;
            auVar197._4_4_ = uVar166;
            auVar197._0_4_ = uVar166;
            auVar197._8_4_ = uVar166;
            auVar197._12_4_ = uVar166;
            auVar85 = vfmadd132ps_fma(auVar197,auVar167,local_760._0_16_);
            auVar177._0_4_ = auVar85._0_4_ * (float)local_800._0_4_;
            auVar177._4_4_ = auVar85._4_4_ * (float)local_800._0_4_;
            auVar177._8_4_ = auVar85._8_4_ * (float)local_800._0_4_;
            auVar177._12_4_ = auVar85._12_4_ * (float)local_800._0_4_;
            auVar85 = vdpps_avx(auVar76,auVar85,0x7f);
            fVar184 = auVar85._0_4_;
            auVar198._0_4_ = auVar76._0_4_ * fVar184;
            auVar198._4_4_ = auVar76._4_4_ * fVar184;
            auVar198._8_4_ = auVar76._8_4_ * fVar184;
            auVar198._12_4_ = auVar76._12_4_ * fVar184;
            auVar85 = vsubps_avx(auVar177,auVar198);
            fVar184 = auVar79._0_4_ * (float)local_820._0_4_;
            auVar167 = vmaxss_avx(ZEXT416((uint)fVar270),
                                  ZEXT416((uint)(local_740._0_4_ * fVar228 * 1.9073486e-06)));
            auVar27._8_4_ = 0x80000000;
            auVar27._0_8_ = 0x8000000080000000;
            auVar27._12_4_ = 0x80000000;
            auVar84 = vxorps_avx512vl(auVar76,auVar27);
            auVar199._0_4_ = fVar222 * auVar85._0_4_ * fVar184;
            auVar199._4_4_ = fVar244 * auVar85._4_4_ * fVar184;
            auVar199._8_4_ = fVar245 * auVar85._8_4_ * fVar184;
            auVar199._12_4_ = fVar246 * auVar85._12_4_ * fVar184;
            auVar263 = ZEXT1664(auVar155);
            auVar85 = vdpps_avx(auVar84,auVar155,0x7f);
            auVar79 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar270),auVar167);
            auVar77 = vdpps_avx(auVar3,auVar199,0x7f);
            auVar185 = vfmadd213ss_fma(ZEXT416((uint)(fVar227 + 1.0)),
                                       ZEXT416((uint)(fVar270 / fVar225)),auVar79);
            fVar222 = auVar85._0_4_ + auVar77._0_4_;
            auVar77 = vdpps_avx(local_7d0,auVar155,0x7f);
            auVar85 = vdpps_avx(auVar3,auVar84,0x7f);
            auVar79 = vmulss_avx512f(auVar83,auVar81);
            fVar225 = auVar82._0_4_ * 1.5 + auVar79._0_4_ * auVar81._0_4_ * auVar81._0_4_;
            auVar79 = vdpps_avx(auVar3,local_7d0,0x7f);
            auVar82 = vfnmadd231ss_fma(auVar85,auVar80,ZEXT416((uint)fVar222));
            auVar79 = vfnmadd231ss_fma(auVar79,auVar80,auVar77);
            auVar85 = vpermilps_avx(_local_640,0xff);
            fVar226 = fVar226 - auVar85._0_4_;
            auVar81 = vshufps_avx(auVar76,auVar76,0xff);
            auVar85 = vfmsub213ss_fma(auVar82,ZEXT416((uint)fVar225),auVar81);
            auVar256._8_4_ = 0x80000000;
            auVar256._0_8_ = 0x8000000080000000;
            auVar256._12_4_ = 0x80000000;
            auVar258 = ZEXT1664(auVar256);
            auVar251._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
            auVar251._8_4_ = auVar85._8_4_ ^ 0x80000000;
            auVar251._12_4_ = auVar85._12_4_ ^ 0x80000000;
            auVar253 = ZEXT1664(auVar251);
            auVar79 = ZEXT416((uint)(auVar79._0_4_ * fVar225));
            auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar85._0_4_)),
                                      ZEXT416((uint)fVar222),auVar79);
            auVar85 = vinsertps_avx(auVar251,auVar79,0x1c);
            auVar238._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
            auVar238._8_4_ = auVar77._8_4_ ^ 0x80000000;
            auVar238._12_4_ = auVar77._12_4_ ^ 0x80000000;
            auVar79 = vinsertps_avx(ZEXT416((uint)fVar222),auVar238,0x10);
            auVar216._0_4_ = auVar82._0_4_;
            auVar216._4_4_ = auVar216._0_4_;
            auVar216._8_4_ = auVar216._0_4_;
            auVar216._12_4_ = auVar216._0_4_;
            auVar77 = vdivps_avx(auVar85,auVar216);
            auVar85 = vdivps_avx(auVar79,auVar216);
            auVar217._0_4_ = fVar224 * auVar77._0_4_ + fVar226 * auVar85._0_4_;
            auVar217._4_4_ = fVar224 * auVar77._4_4_ + fVar226 * auVar85._4_4_;
            auVar217._8_4_ = fVar224 * auVar77._8_4_ + fVar226 * auVar85._8_4_;
            auVar217._12_4_ = fVar224 * auVar77._12_4_ + fVar226 * auVar85._12_4_;
            auVar77 = vsubps_avx(local_740._0_16_,auVar217);
            auVar28._8_4_ = 0x7fffffff;
            auVar28._0_8_ = 0x7fffffff7fffffff;
            auVar28._12_4_ = 0x7fffffff;
            auVar85 = vandps_avx512vl(auVar80,auVar28);
            if (auVar85._0_4_ < auVar185._0_4_) {
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar185._0_4_ + auVar167._0_4_)),local_6e0,
                                        ZEXT416(0x36000000));
              auVar29._8_4_ = 0x7fffffff;
              auVar29._0_8_ = 0x7fffffff7fffffff;
              auVar29._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(ZEXT416((uint)fVar226),auVar29);
              if (auVar79._0_4_ < auVar85._0_4_) {
                bVar71 = uVar67 < 5;
                fVar228 = auVar77._0_4_ + (float)local_6f0._0_4_;
                if ((fVar2 <= fVar228) &&
                   (fVar270 = *(float *)(ray + k * 4 + 0x100), fVar228 <= fVar270)) {
                  auVar85 = vmovshdup_avx(auVar77);
                  bVar66 = 0;
                  if ((auVar85._0_4_ < 0.0) || (1.0 < auVar85._0_4_)) goto LAB_01ba268c;
                  auVar218._0_12_ = ZEXT812(0);
                  auVar218._12_4_ = 0;
                  auVar140._16_16_ = auVar137._16_16_;
                  auVar140._0_16_ = auVar218;
                  auVar139._4_28_ = auVar140._4_28_;
                  auVar139._0_4_ = fVar223;
                  auVar85 = vrsqrt14ss_avx512f(auVar218,auVar139._0_16_);
                  fVar222 = auVar85._0_4_;
                  auVar78 = vmulss_avx512f(auVar78,ZEXT416(0xbf000000));
                  pGVar5 = (context->scene->geometries).items[uVar4].ptr;
                  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar66 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01ba268c;
                    fVar222 = fVar222 * 1.5 + auVar78._0_4_ * fVar222 * fVar222 * fVar222;
                    auVar200._0_4_ = auVar3._0_4_ * fVar222;
                    auVar200._4_4_ = auVar3._4_4_ * fVar222;
                    auVar200._8_4_ = auVar3._8_4_ * fVar222;
                    auVar200._12_4_ = auVar3._12_4_ * fVar222;
                    auVar79 = vfmadd213ps_fma(auVar81,auVar200,auVar76);
                    auVar78 = vshufps_avx(auVar200,auVar200,0xc9);
                    auVar85 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar201._0_4_ = auVar200._0_4_ * auVar85._0_4_;
                    auVar201._4_4_ = auVar200._4_4_ * auVar85._4_4_;
                    auVar201._8_4_ = auVar200._8_4_ * auVar85._8_4_;
                    auVar201._12_4_ = auVar200._12_4_ * auVar85._12_4_;
                    auVar76 = vfmsub231ps_fma(auVar201,auVar76,auVar78);
                    auVar78 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar85 = vshufps_avx(auVar79,auVar79,0xc9);
                    auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                    auVar157._0_4_ = auVar79._0_4_ * auVar76._0_4_;
                    auVar157._4_4_ = auVar79._4_4_ * auVar76._4_4_;
                    auVar157._8_4_ = auVar79._8_4_ * auVar76._8_4_;
                    auVar157._12_4_ = auVar79._12_4_ * auVar76._12_4_;
                    auVar78 = vfmsub231ps_fma(auVar157,auVar78,auVar85);
                    auVar220._8_4_ = 1;
                    auVar220._0_8_ = 0x100000001;
                    auVar220._12_4_ = 1;
                    auVar220._16_4_ = 1;
                    auVar220._20_4_ = 1;
                    auVar220._24_4_ = 1;
                    auVar220._28_4_ = 1;
                    local_460 = vpermps_avx2(auVar220,ZEXT1632(auVar77));
                    auVar109 = vpermps_avx2(auVar220,ZEXT1632(auVar78));
                    auVar236._8_4_ = 2;
                    auVar236._0_8_ = 0x200000002;
                    auVar236._12_4_ = 2;
                    auVar236._16_4_ = 2;
                    auVar236._20_4_ = 2;
                    auVar236._24_4_ = 2;
                    auVar236._28_4_ = 2;
                    local_4a0 = vpermps_avx2(auVar236,ZEXT1632(auVar78));
                    local_480 = auVar78._0_4_;
                    local_4c0[0] = (RTCHitN)auVar109[0];
                    local_4c0[1] = (RTCHitN)auVar109[1];
                    local_4c0[2] = (RTCHitN)auVar109[2];
                    local_4c0[3] = (RTCHitN)auVar109[3];
                    local_4c0[4] = (RTCHitN)auVar109[4];
                    local_4c0[5] = (RTCHitN)auVar109[5];
                    local_4c0[6] = (RTCHitN)auVar109[6];
                    local_4c0[7] = (RTCHitN)auVar109[7];
                    local_4c0[8] = (RTCHitN)auVar109[8];
                    local_4c0[9] = (RTCHitN)auVar109[9];
                    local_4c0[10] = (RTCHitN)auVar109[10];
                    local_4c0[0xb] = (RTCHitN)auVar109[0xb];
                    local_4c0[0xc] = (RTCHitN)auVar109[0xc];
                    local_4c0[0xd] = (RTCHitN)auVar109[0xd];
                    local_4c0[0xe] = (RTCHitN)auVar109[0xe];
                    local_4c0[0xf] = (RTCHitN)auVar109[0xf];
                    local_4c0[0x10] = (RTCHitN)auVar109[0x10];
                    local_4c0[0x11] = (RTCHitN)auVar109[0x11];
                    local_4c0[0x12] = (RTCHitN)auVar109[0x12];
                    local_4c0[0x13] = (RTCHitN)auVar109[0x13];
                    local_4c0[0x14] = (RTCHitN)auVar109[0x14];
                    local_4c0[0x15] = (RTCHitN)auVar109[0x15];
                    local_4c0[0x16] = (RTCHitN)auVar109[0x16];
                    local_4c0[0x17] = (RTCHitN)auVar109[0x17];
                    local_4c0[0x18] = (RTCHitN)auVar109[0x18];
                    local_4c0[0x19] = (RTCHitN)auVar109[0x19];
                    local_4c0[0x1a] = (RTCHitN)auVar109[0x1a];
                    local_4c0[0x1b] = (RTCHitN)auVar109[0x1b];
                    local_4c0[0x1c] = (RTCHitN)auVar109[0x1c];
                    local_4c0[0x1d] = (RTCHitN)auVar109[0x1d];
                    local_4c0[0x1e] = (RTCHitN)auVar109[0x1e];
                    local_4c0[0x1f] = (RTCHitN)auVar109[0x1f];
                    uStack_47c = local_480;
                    uStack_478 = local_480;
                    uStack_474 = local_480;
                    uStack_470 = local_480;
                    uStack_46c = local_480;
                    uStack_468 = local_480;
                    uStack_464 = local_480;
                    local_440 = ZEXT432(0) << 0x20;
                    local_420 = local_4e0._0_8_;
                    uStack_418 = local_4e0._8_8_;
                    uStack_410 = local_4e0._16_8_;
                    uStack_408 = local_4e0._24_8_;
                    local_400 = local_500;
                    vpcmpeqd_avx2(local_500,local_500);
                    local_3e0 = context->user->instID[0];
                    uStack_3dc = local_3e0;
                    uStack_3d8 = local_3e0;
                    uStack_3d4 = local_3e0;
                    uStack_3d0 = local_3e0;
                    uStack_3cc = local_3e0;
                    uStack_3c8 = local_3e0;
                    uStack_3c4 = local_3e0;
                    local_3c0 = context->user->instPrimID[0];
                    uStack_3bc = local_3c0;
                    uStack_3b8 = local_3c0;
                    uStack_3b4 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3ac = local_3c0;
                    uStack_3a8 = local_3c0;
                    uStack_3a4 = local_3c0;
                    *(float *)(ray + k * 4 + 0x100) = fVar228;
                    local_720 = local_540;
                    local_850.valid = (int *)local_720;
                    local_850.geometryUserPtr = pGVar5->userPtr;
                    local_850.context = context->user;
                    local_850.hit = local_4c0;
                    local_850.N = 8;
                    local_850.ray = (RTCRayN *)ray;
                    if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar253 = ZEXT1664(auVar251);
                      auVar258 = ZEXT1664(auVar256);
                      auVar262 = ZEXT1664(auVar3);
                      auVar263 = ZEXT1664(auVar155);
                      (*pGVar5->occlusionFilterN)(&local_850);
                      auVar109 = vmovdqa64_avx512vl(auVar105);
                      auVar272 = ZEXT3264(auVar109);
                      auVar109 = vmovdqa64_avx512vl(auVar103);
                      auVar271 = ZEXT3264(auVar109);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        auVar258 = ZEXT1664(auVar258._0_16_);
                        auVar262 = ZEXT1664(auVar262._0_16_);
                        auVar263 = ZEXT1664(auVar263._0_16_);
                        (*p_Var9)(&local_850);
                        auVar109 = vmovdqa64_avx512vl(auVar105);
                        auVar272 = ZEXT3264(auVar109);
                        auVar109 = vmovdqa64_avx512vl(auVar103);
                        auVar271 = ZEXT3264(auVar109);
                      }
                      uVar72 = vptestmd_avx512vl(local_720,local_720);
                      auVar109 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar10 = (bool)((byte)uVar72 & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar17 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_850.ray + 0x100) =
                           (uint)bVar10 * auVar109._0_4_ |
                           (uint)!bVar10 * *(int *)(local_850.ray + 0x100);
                      *(uint *)(local_850.ray + 0x104) =
                           (uint)bVar11 * auVar109._4_4_ |
                           (uint)!bVar11 * *(int *)(local_850.ray + 0x104);
                      *(uint *)(local_850.ray + 0x108) =
                           (uint)bVar12 * auVar109._8_4_ |
                           (uint)!bVar12 * *(int *)(local_850.ray + 0x108);
                      *(uint *)(local_850.ray + 0x10c) =
                           (uint)bVar13 * auVar109._12_4_ |
                           (uint)!bVar13 * *(int *)(local_850.ray + 0x10c);
                      *(uint *)(local_850.ray + 0x110) =
                           (uint)bVar14 * auVar109._16_4_ |
                           (uint)!bVar14 * *(int *)(local_850.ray + 0x110);
                      *(uint *)(local_850.ray + 0x114) =
                           (uint)bVar15 * auVar109._20_4_ |
                           (uint)!bVar15 * *(int *)(local_850.ray + 0x114);
                      *(uint *)(local_850.ray + 0x118) =
                           (uint)bVar16 * auVar109._24_4_ |
                           (uint)!bVar16 * *(int *)(local_850.ray + 0x118);
                      *(uint *)(local_850.ray + 0x11c) =
                           (uint)bVar17 * auVar109._28_4_ |
                           (uint)!bVar17 * *(int *)(local_850.ray + 0x11c);
                      bVar66 = 1;
                      if (local_720 != (undefined1  [32])0x0) goto LAB_01ba268c;
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar270;
                  }
                }
                bVar66 = 0;
                goto LAB_01ba268c;
              }
            }
            uVar67 = uVar67 + 1;
          }
          bVar71 = false;
LAB_01ba268c:
          bVar63 = bVar63 | bVar71 & bVar66;
          uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar240._4_4_ = uVar166;
          auVar240._0_4_ = uVar166;
          auVar240._8_4_ = uVar166;
          auVar240._12_4_ = uVar166;
          auVar240._16_4_ = uVar166;
          auVar240._20_4_ = uVar166;
          auVar240._24_4_ = uVar166;
          auVar240._28_4_ = uVar166;
          auVar241 = ZEXT3264(auVar240);
          auVar58._4_4_ = fStack_57c;
          auVar58._0_4_ = local_580;
          auVar58._8_4_ = fStack_578;
          auVar58._12_4_ = fStack_574;
          auVar58._16_4_ = fStack_570;
          auVar58._20_4_ = fStack_56c;
          auVar58._24_4_ = fStack_568;
          auVar58._28_4_ = fStack_564;
          uVar18 = vcmpps_avx512vl(auVar240,auVar58,0xd);
        }
        uVar20 = vpcmpd_avx512vl(local_520,local_360,1);
        uVar19 = vpcmpd_avx512vl(local_520,_local_5a0,1);
        auVar181._0_4_ = (float)local_5c0._0_4_ + (float)local_1c0._0_4_;
        auVar181._4_4_ = (float)local_5c0._4_4_ + (float)local_1c0._4_4_;
        auVar181._8_4_ = fStack_5b8 + fStack_1b8;
        auVar181._12_4_ = fStack_5b4 + fStack_1b4;
        auVar181._16_4_ = fStack_5b0 + fStack_1b0;
        auVar181._20_4_ = fStack_5ac + fStack_1ac;
        auVar181._24_4_ = fStack_5a8 + fStack_1a8;
        auVar181._28_4_ = fStack_5a4 + fStack_1a4;
        uVar166 = auVar241._0_4_;
        auVar203._4_4_ = uVar166;
        auVar203._0_4_ = uVar166;
        auVar203._8_4_ = uVar166;
        auVar203._12_4_ = uVar166;
        auVar203._16_4_ = uVar166;
        auVar203._20_4_ = uVar166;
        auVar203._24_4_ = uVar166;
        auVar203._28_4_ = uVar166;
        uVar18 = vcmpps_avx512vl(auVar181,auVar203,2);
        bVar65 = bVar65 & (byte)uVar20 & (byte)uVar18;
        auVar221._0_4_ = (float)local_5c0._0_4_ + (float)local_3a0._0_4_;
        auVar221._4_4_ = (float)local_5c0._4_4_ + (float)local_3a0._4_4_;
        auVar221._8_4_ = fStack_5b8 + fStack_398;
        auVar221._12_4_ = fStack_5b4 + fStack_394;
        auVar221._16_4_ = fStack_5b0 + fStack_390;
        auVar221._20_4_ = fStack_5ac + fStack_38c;
        auVar221._24_4_ = fStack_5a8 + fStack_388;
        auVar221._28_4_ = fStack_5a4 + fStack_384;
        uVar18 = vcmpps_avx512vl(auVar221,auVar203,2);
        bVar60 = bVar60 & (byte)uVar19 & (byte)uVar18 | bVar65;
        if (bVar60 != 0) {
          abStack_180[uVar70 * 0x60] = bVar60;
          bVar71 = (bool)(bVar65 >> 1 & 1);
          bVar10 = (bool)(bVar65 >> 2 & 1);
          bVar11 = (bool)(bVar65 >> 3 & 1);
          bVar12 = (bool)(bVar65 >> 4 & 1);
          bVar13 = (bool)(bVar65 >> 5 & 1);
          auStack_160[uVar70 * 0x18] =
               (uint)(bVar65 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar65 & 1) * local_3a0._0_4_;
          auStack_160[uVar70 * 0x18 + 1] =
               (uint)bVar71 * local_1c0._4_4_ | (uint)!bVar71 * local_3a0._4_4_;
          auStack_160[uVar70 * 0x18 + 2] =
               (uint)bVar10 * (int)fStack_1b8 | (uint)!bVar10 * (int)fStack_398;
          auStack_160[uVar70 * 0x18 + 3] =
               (uint)bVar11 * (int)fStack_1b4 | (uint)!bVar11 * (int)fStack_394;
          auStack_160[uVar70 * 0x18 + 4] =
               (uint)bVar12 * (int)fStack_1b0 | (uint)!bVar12 * (int)fStack_390;
          auStack_160[uVar70 * 0x18 + 5] =
               (uint)bVar13 * (int)fStack_1ac | (uint)!bVar13 * (int)fStack_38c;
          auStack_160[uVar70 * 0x18 + 6] =
               (uint)(bVar65 >> 6) * (int)fStack_1a8 | (uint)!(bool)(bVar65 >> 6) * (int)fStack_388;
          (&fStack_144)[uVar70 * 0x18] = fStack_384;
          uVar72 = vmovlps_avx(local_550);
          (&uStack_140)[uVar70 * 0xc] = uVar72;
          aiStack_138[uVar70 * 0x18] = local_acc + 1;
          uVar70 = (ulong)((int)uVar70 + 1);
        }
      }
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar273 = ZEXT3264(auVar108);
      auVar241 = ZEXT3264(_DAT_01f7b040);
    }
    do {
      uVar73 = (uint)uVar70;
      uVar70 = (ulong)(uVar73 - 1);
      if (uVar73 == 0) {
        if (bVar63 != 0) goto LAB_01ba2c63;
        uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar37._4_4_ = uVar166;
        auVar37._0_4_ = uVar166;
        auVar37._8_4_ = uVar166;
        auVar37._12_4_ = uVar166;
        auVar37._16_4_ = uVar166;
        auVar37._20_4_ = uVar166;
        auVar37._24_4_ = uVar166;
        auVar37._28_4_ = uVar166;
        uVar18 = vcmpps_avx512vl(local_340,auVar37,2);
        local_6a8 = (ulong)((uint)uVar18 & (uint)local_6a8 - 1 & (uint)local_6a8);
        goto LAB_01ba0239;
      }
      auVar108 = *(undefined1 (*) [32])(auStack_160 + uVar70 * 0x18);
      auVar182._0_4_ = auVar108._0_4_ + (float)local_5c0._0_4_;
      auVar182._4_4_ = auVar108._4_4_ + (float)local_5c0._4_4_;
      auVar182._8_4_ = auVar108._8_4_ + fStack_5b8;
      auVar182._12_4_ = auVar108._12_4_ + fStack_5b4;
      auVar182._16_4_ = auVar108._16_4_ + fStack_5b0;
      auVar182._20_4_ = auVar108._20_4_ + fStack_5ac;
      auVar182._24_4_ = auVar108._24_4_ + fStack_5a8;
      auVar182._28_4_ = auVar108._28_4_ + fStack_5a4;
      uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar36._4_4_ = uVar166;
      auVar36._0_4_ = uVar166;
      auVar36._8_4_ = uVar166;
      auVar36._12_4_ = uVar166;
      auVar36._16_4_ = uVar166;
      auVar36._20_4_ = uVar166;
      auVar36._24_4_ = uVar166;
      auVar36._28_4_ = uVar166;
      uVar18 = vcmpps_avx512vl(auVar182,auVar36,2);
      uVar142 = (uint)uVar18 & (uint)abStack_180[uVar70 * 0x60];
    } while (uVar142 == 0);
    uVar72 = (&uStack_140)[uVar70 * 0xc];
    auVar178._8_8_ = 0;
    auVar178._0_8_ = uVar72;
    auVar204._8_4_ = 0x7f800000;
    auVar204._0_8_ = 0x7f8000007f800000;
    auVar204._12_4_ = 0x7f800000;
    auVar204._16_4_ = 0x7f800000;
    auVar204._20_4_ = 0x7f800000;
    auVar204._24_4_ = 0x7f800000;
    auVar204._28_4_ = 0x7f800000;
    auVar109 = vblendmps_avx512vl(auVar204,auVar108);
    bVar60 = (byte)uVar142;
    auVar141._0_4_ =
         (uint)(bVar60 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar60 & 1) * (int)auVar108._0_4_;
    bVar71 = (bool)((byte)(uVar142 >> 1) & 1);
    auVar141._4_4_ = (uint)bVar71 * auVar109._4_4_ | (uint)!bVar71 * (int)auVar108._4_4_;
    bVar71 = (bool)((byte)(uVar142 >> 2) & 1);
    auVar141._8_4_ = (uint)bVar71 * auVar109._8_4_ | (uint)!bVar71 * (int)auVar108._8_4_;
    bVar71 = (bool)((byte)(uVar142 >> 3) & 1);
    auVar141._12_4_ = (uint)bVar71 * auVar109._12_4_ | (uint)!bVar71 * (int)auVar108._12_4_;
    bVar71 = (bool)((byte)(uVar142 >> 4) & 1);
    auVar141._16_4_ = (uint)bVar71 * auVar109._16_4_ | (uint)!bVar71 * (int)auVar108._16_4_;
    bVar71 = (bool)((byte)(uVar142 >> 5) & 1);
    auVar141._20_4_ = (uint)bVar71 * auVar109._20_4_ | (uint)!bVar71 * (int)auVar108._20_4_;
    bVar71 = (bool)((byte)(uVar142 >> 6) & 1);
    auVar141._24_4_ = (uint)bVar71 * auVar109._24_4_ | (uint)!bVar71 * (int)auVar108._24_4_;
    auVar141._28_4_ =
         (uVar142 >> 7) * auVar109._28_4_ | (uint)!SUB41(uVar142 >> 7,0) * (int)auVar108._28_4_;
    auVar108 = vshufps_avx(auVar141,auVar141,0xb1);
    auVar108 = vminps_avx(auVar141,auVar108);
    auVar109 = vshufpd_avx(auVar108,auVar108,5);
    auVar108 = vminps_avx(auVar108,auVar109);
    auVar109 = vpermpd_avx2(auVar108,0x4e);
    auVar108 = vminps_avx(auVar108,auVar109);
    uVar18 = vcmpps_avx512vl(auVar141,auVar108,0);
    bVar68 = (byte)uVar18 & bVar60;
    if (bVar68 != 0) {
      uVar142 = (uint)bVar68;
    }
    uVar143 = 0;
    for (; (uVar142 & 1) == 0; uVar142 = uVar142 >> 1 | 0x80000000) {
      uVar143 = uVar143 + 1;
    }
    local_acc = aiStack_138[uVar70 * 0x18];
    bVar60 = ~('\x01' << ((byte)uVar143 & 0x1f)) & bVar60;
    abStack_180[uVar70 * 0x60] = bVar60;
    if (bVar60 == 0) {
      uVar73 = uVar73 - 1;
    }
    uVar166 = (undefined4)uVar72;
    auVar165._4_4_ = uVar166;
    auVar165._0_4_ = uVar166;
    auVar165._8_4_ = uVar166;
    auVar165._12_4_ = uVar166;
    auVar165._16_4_ = uVar166;
    auVar165._20_4_ = uVar166;
    auVar165._24_4_ = uVar166;
    auVar165._28_4_ = uVar166;
    auVar77 = vmovshdup_avx(auVar178);
    auVar77 = vsubps_avx(auVar77,auVar178);
    auVar183._0_4_ = auVar77._0_4_;
    auVar183._4_4_ = auVar183._0_4_;
    auVar183._8_4_ = auVar183._0_4_;
    auVar183._12_4_ = auVar183._0_4_;
    auVar183._16_4_ = auVar183._0_4_;
    auVar183._20_4_ = auVar183._0_4_;
    auVar183._24_4_ = auVar183._0_4_;
    auVar183._28_4_ = auVar183._0_4_;
    auVar77 = vfmadd132ps_fma(auVar183,auVar165,auVar241._0_32_);
    auVar108 = ZEXT1632(auVar77);
    local_4c0[0] = (RTCHitN)auVar108[0];
    local_4c0[1] = (RTCHitN)auVar108[1];
    local_4c0[2] = (RTCHitN)auVar108[2];
    local_4c0[3] = (RTCHitN)auVar108[3];
    local_4c0[4] = (RTCHitN)auVar108[4];
    local_4c0[5] = (RTCHitN)auVar108[5];
    local_4c0[6] = (RTCHitN)auVar108[6];
    local_4c0[7] = (RTCHitN)auVar108[7];
    local_4c0[8] = (RTCHitN)auVar108[8];
    local_4c0[9] = (RTCHitN)auVar108[9];
    local_4c0[10] = (RTCHitN)auVar108[10];
    local_4c0[0xb] = (RTCHitN)auVar108[0xb];
    local_4c0[0xc] = (RTCHitN)auVar108[0xc];
    local_4c0[0xd] = (RTCHitN)auVar108[0xd];
    local_4c0[0xe] = (RTCHitN)auVar108[0xe];
    local_4c0[0xf] = (RTCHitN)auVar108[0xf];
    local_4c0[0x10] = (RTCHitN)auVar108[0x10];
    local_4c0[0x11] = (RTCHitN)auVar108[0x11];
    local_4c0[0x12] = (RTCHitN)auVar108[0x12];
    local_4c0[0x13] = (RTCHitN)auVar108[0x13];
    local_4c0[0x14] = (RTCHitN)auVar108[0x14];
    local_4c0[0x15] = (RTCHitN)auVar108[0x15];
    local_4c0[0x16] = (RTCHitN)auVar108[0x16];
    local_4c0[0x17] = (RTCHitN)auVar108[0x17];
    local_4c0[0x18] = (RTCHitN)auVar108[0x18];
    local_4c0[0x19] = (RTCHitN)auVar108[0x19];
    local_4c0[0x1a] = (RTCHitN)auVar108[0x1a];
    local_4c0[0x1b] = (RTCHitN)auVar108[0x1b];
    local_4c0[0x1c] = (RTCHitN)auVar108[0x1c];
    local_4c0[0x1d] = (RTCHitN)auVar108[0x1d];
    local_4c0[0x1e] = (RTCHitN)auVar108[0x1e];
    local_4c0[0x1f] = (RTCHitN)auVar108[0x1f];
    local_550._8_8_ = 0;
    local_550._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar143 * 4);
    uVar70 = (ulong)uVar73;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }